

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [12];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  byte bVar43;
  byte bVar44;
  byte bVar45;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar46;
  uint uVar47;
  byte bVar48;
  undefined1 auVar49 [8];
  ulong uVar50;
  undefined8 unaff_R13;
  bool bVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar112;
  uint uVar113;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar115;
  uint uVar116;
  uint uVar117;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  uint uVar114;
  uint uVar118;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar119;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar136;
  float fVar137;
  undefined4 uVar138;
  float fVar154;
  float fVar156;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar150 [32];
  undefined1 auVar141 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  vint4 ai_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  vint4 bi;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar206 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  vint4 ai;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  vint4 ai_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined4 uVar230;
  undefined4 uVar231;
  undefined1 auVar229 [64];
  undefined4 uVar232;
  undefined1 auVar234 [32];
  undefined1 auVar233 [28];
  undefined1 auVar235 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  undefined4 uVar240;
  undefined4 uVar241;
  undefined1 auVar242 [16];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a00;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_8b0 [16];
  ulong local_898;
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 auStack_810 [16];
  Primitive *local_800;
  ulong local_7f8;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar50 = (ulong)(byte)prim[1];
  fVar119 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar62 = vsubps_avx(auVar62,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar189._0_4_ = fVar119 * auVar62._0_4_;
  auVar189._4_4_ = fVar119 * auVar62._4_4_;
  auVar189._8_4_ = fVar119 * auVar62._8_4_;
  auVar189._12_4_ = fVar119 * auVar62._12_4_;
  auVar121._0_4_ = fVar119 * auVar61._0_4_;
  auVar121._4_4_ = fVar119 * auVar61._4_4_;
  auVar121._8_4_ = fVar119 * auVar61._8_4_;
  auVar121._12_4_ = fVar119 * auVar61._12_4_;
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xc + 6)));
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xd + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x12 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x13 + 6)));
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x14 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar237._4_4_ = auVar121._0_4_;
  auVar237._0_4_ = auVar121._0_4_;
  auVar237._8_4_ = auVar121._0_4_;
  auVar237._12_4_ = auVar121._0_4_;
  auVar68 = vshufps_avx(auVar121,auVar121,0x55);
  auVar67 = vshufps_avx(auVar121,auVar121,0xaa);
  fVar119 = auVar67._0_4_;
  auVar198._0_4_ = fVar119 * auVar56._0_4_;
  fVar136 = auVar67._4_4_;
  auVar198._4_4_ = fVar136 * auVar56._4_4_;
  fVar154 = auVar67._8_4_;
  auVar198._8_4_ = fVar154 * auVar56._8_4_;
  fVar156 = auVar67._12_4_;
  auVar198._12_4_ = fVar156 * auVar56._12_4_;
  auVar139._0_4_ = auVar57._0_4_ * fVar119;
  auVar139._4_4_ = auVar57._4_4_ * fVar136;
  auVar139._8_4_ = auVar57._8_4_ * fVar154;
  auVar139._12_4_ = auVar57._12_4_ * fVar156;
  auVar122._0_4_ = auVar58._0_4_ * fVar119;
  auVar122._4_4_ = auVar58._4_4_ * fVar136;
  auVar122._8_4_ = auVar58._8_4_ * fVar154;
  auVar122._12_4_ = auVar58._12_4_ * fVar156;
  auVar67 = vfmadd231ps_fma(auVar198,auVar68,auVar61);
  auVar60 = vfmadd231ps_fma(auVar139,auVar68,auVar63);
  auVar68 = vfmadd231ps_fma(auVar122,auVar64,auVar68);
  auVar59 = vfmadd231ps_fma(auVar67,auVar237,auVar62);
  auVar60 = vfmadd231ps_fma(auVar60,auVar237,auVar65);
  auVar121 = vfmadd231ps_fma(auVar68,auVar66,auVar237);
  auVar238._4_4_ = auVar189._0_4_;
  auVar238._0_4_ = auVar189._0_4_;
  auVar238._8_4_ = auVar189._0_4_;
  auVar238._12_4_ = auVar189._0_4_;
  auVar68 = vshufps_avx(auVar189,auVar189,0x55);
  auVar67 = vshufps_avx(auVar189,auVar189,0xaa);
  auVar56 = vmulps_avx512vl(auVar67,auVar56);
  auVar190._0_4_ = auVar67._0_4_ * auVar57._0_4_;
  auVar190._4_4_ = auVar67._4_4_ * auVar57._4_4_;
  auVar190._8_4_ = auVar67._8_4_ * auVar57._8_4_;
  auVar190._12_4_ = auVar67._12_4_ * auVar57._12_4_;
  auVar166._0_4_ = auVar67._0_4_ * auVar58._0_4_;
  auVar166._4_4_ = auVar67._4_4_ * auVar58._4_4_;
  auVar166._8_4_ = auVar67._8_4_ * auVar58._8_4_;
  auVar166._12_4_ = auVar67._12_4_ * auVar58._12_4_;
  auVar57 = vfmadd231ps_avx512vl(auVar56,auVar68,auVar61);
  auVar61 = vfmadd231ps_fma(auVar190,auVar68,auVar63);
  auVar56 = vfmadd231ps_fma(auVar166,auVar68,auVar64);
  auVar58 = vfmadd231ps_avx512vl(auVar57,auVar238,auVar62);
  auVar63 = vfmadd231ps_fma(auVar61,auVar238,auVar65);
  auVar64 = vfmadd231ps_fma(auVar56,auVar238,auVar66);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar62 = vandps_avx(auVar59,auVar225);
  uVar54 = vcmpps_avx512vl(auVar62,auVar210,1);
  bVar51 = (bool)((byte)uVar54 & 1);
  auVar67._0_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar59._0_4_;
  bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar59._4_4_;
  bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar59._8_4_;
  bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar59._12_4_;
  auVar62 = vandps_avx(auVar60,auVar225);
  uVar54 = vcmpps_avx512vl(auVar62,auVar210,1);
  bVar51 = (bool)((byte)uVar54 & 1);
  auVar59._0_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar60._0_4_;
  bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar60._4_4_;
  bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar60._8_4_;
  bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar60._12_4_;
  auVar62 = vandps_avx(auVar121,auVar225);
  uVar54 = vcmpps_avx512vl(auVar62,auVar210,1);
  bVar51 = (bool)((byte)uVar54 & 1);
  auVar60._0_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar121._0_4_;
  bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar121._4_4_;
  bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar121._8_4_;
  bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar51 * 0x219392ef | (uint)!bVar51 * auVar121._12_4_;
  auVar61 = vrcp14ps_avx512vl(auVar67);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = 0x3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar62 = vfnmadd213ps_fma(auVar67,auVar61,auVar217);
  auVar56 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar59);
  auVar62 = vfnmadd213ps_fma(auVar59,auVar61,auVar217);
  auVar57 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar60);
  auVar62 = vfnmadd213ps_fma(auVar60,auVar61,auVar217);
  auVar66 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx512vl(auVar62,auVar58);
  auVar211._0_4_ = auVar56._0_4_ * auVar62._0_4_;
  auVar211._4_4_ = auVar56._4_4_ * auVar62._4_4_;
  auVar211._8_4_ = auVar56._8_4_ * auVar62._8_4_;
  auVar211._12_4_ = auVar56._12_4_ * auVar62._12_4_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar62 = vpmovsxwd_avx(auVar61);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx512vl(auVar62,auVar58);
  auVar199._0_4_ = auVar56._0_4_ * auVar62._0_4_;
  auVar199._4_4_ = auVar56._4_4_ * auVar62._4_4_;
  auVar199._8_4_ = auVar56._8_4_ * auVar62._8_4_;
  auVar199._12_4_ = auVar56._12_4_ * auVar62._12_4_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar50 * 0xe + 6);
  auVar62 = vpmovsxwd_avx(auVar56);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,auVar63);
  auVar218._0_4_ = auVar57._0_4_ * auVar62._0_4_;
  auVar218._4_4_ = auVar57._4_4_ * auVar62._4_4_;
  auVar218._8_4_ = auVar57._8_4_ * auVar62._8_4_;
  auVar218._12_4_ = auVar57._12_4_ * auVar62._12_4_;
  auVar56 = vpbroadcastd_avx512vl();
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar62 = vpmovsxwd_avx(auVar65);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar61 = vsubps_avx(auVar62,auVar63);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar50 * 0x15 + 6);
  auVar62 = vpmovsxwd_avx(auVar63);
  auVar140._0_4_ = auVar57._0_4_ * auVar61._0_4_;
  auVar140._4_4_ = auVar57._4_4_ * auVar61._4_4_;
  auVar140._8_4_ = auVar57._8_4_ * auVar61._8_4_;
  auVar140._12_4_ = auVar57._12_4_ * auVar61._12_4_;
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,auVar64);
  auVar191._0_4_ = auVar66._0_4_ * auVar62._0_4_;
  auVar191._4_4_ = auVar66._4_4_ * auVar62._4_4_;
  auVar191._8_4_ = auVar66._8_4_ * auVar62._8_4_;
  auVar191._12_4_ = auVar66._12_4_ * auVar62._12_4_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar62 = vpmovsxwd_avx(auVar57);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,auVar64);
  auVar123._0_4_ = auVar66._0_4_ * auVar62._0_4_;
  auVar123._4_4_ = auVar66._4_4_ * auVar62._4_4_;
  auVar123._8_4_ = auVar66._8_4_ * auVar62._8_4_;
  auVar123._12_4_ = auVar66._12_4_ * auVar62._12_4_;
  auVar62 = vpminsd_avx(auVar211,auVar199);
  auVar61 = vpminsd_avx(auVar218,auVar140);
  auVar62 = vmaxps_avx(auVar62,auVar61);
  auVar61 = vpminsd_avx(auVar191,auVar123);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar66._4_4_ = uVar138;
  auVar66._0_4_ = uVar138;
  auVar66._8_4_ = uVar138;
  auVar66._12_4_ = uVar138;
  auVar61 = vmaxps_avx512vl(auVar61,auVar66);
  auVar62 = vmaxps_avx(auVar62,auVar61);
  auVar64._8_4_ = 0x3f7ffffa;
  auVar64._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar64._12_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar62,auVar64);
  auVar62 = vpmaxsd_avx(auVar211,auVar199);
  auVar61 = vpmaxsd_avx(auVar218,auVar140);
  auVar62 = vminps_avx(auVar62,auVar61);
  auVar61 = vpmaxsd_avx(auVar191,auVar123);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar58._4_4_ = uVar138;
  auVar58._0_4_ = uVar138;
  auVar58._8_4_ = uVar138;
  auVar58._12_4_ = uVar138;
  auVar61 = vminps_avx512vl(auVar61,auVar58);
  auVar62 = vminps_avx(auVar62,auVar61);
  auVar68._8_4_ = 0x3f800003;
  auVar68._0_8_ = 0x3f8000033f800003;
  auVar68._12_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar68);
  uVar10 = vcmpps_avx512vl(local_300,auVar62,2);
  uVar12 = vpcmpgtd_avx512vl(auVar56,_DAT_01f4ad30);
  local_7f8 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar10 & 0xf & (byte)uVar12));
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_800 = prim;
LAB_0182590f:
  if (local_7f8 == 0) {
LAB_01828150:
    return local_7f8 != 0;
  }
  lVar14 = 0;
  for (uVar54 = local_7f8; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar14 = lVar14 + 1;
  }
  local_898 = (ulong)*(uint *)(prim + 2);
  pGVar1 = (context->scene->geometries).items[local_898].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar1->field_0x58 +
                           pGVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar14 * 4 + 6));
  p_Var2 = pGVar1[1].intersectionFilterN;
  lVar14 = *(long *)&pGVar1[1].time_range.upper;
  auVar62 = *(undefined1 (*) [16])(lVar14 + (long)p_Var2 * uVar54);
  auVar61 = *(undefined1 (*) [16])(lVar14 + (uVar54 + 1) * (long)p_Var2);
  auVar56 = *(undefined1 (*) [16])(lVar14 + (uVar54 + 2) * (long)p_Var2);
  local_5c8 = local_7f8 - 1 & local_7f8;
  auVar65 = *(undefined1 (*) [16])(lVar14 + (uVar54 + 3) * (long)p_Var2);
  if (local_5c8 != 0) {
    uVar50 = local_5c8 - 1 & local_5c8;
    for (uVar54 = local_5c8; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar50 != 0) {
      for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar57 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar63 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  _local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar58 = local_3c0._0_16_;
  local_6b0 = vinsertps_avx512f(auVar63,auVar58,0x28);
  auVar212._0_4_ = auVar62._0_4_ + auVar61._0_4_ + auVar56._0_4_ + auVar65._0_4_;
  auVar212._4_4_ = auVar62._4_4_ + auVar61._4_4_ + auVar56._4_4_ + auVar65._4_4_;
  auVar212._8_4_ = auVar62._8_4_ + auVar61._8_4_ + auVar56._8_4_ + auVar65._8_4_;
  auVar212._12_4_ = auVar62._12_4_ + auVar61._12_4_ + auVar56._12_4_ + auVar65._12_4_;
  auVar15._8_4_ = 0x3e800000;
  auVar15._0_8_ = 0x3e8000003e800000;
  auVar15._12_4_ = 0x3e800000;
  auVar63 = vmulps_avx512vl(auVar212,auVar15);
  auVar63 = vsubps_avx(auVar63,auVar57);
  auVar63 = vdpps_avx(auVar63,local_6b0,0x7f);
  fVar119 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = local_6c0._0_4_;
  auVar64 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar66 = vfnmadd213ss_fma(auVar64,local_6c0,ZEXT416(0x40000000));
  local_260 = auVar63._0_4_ * auVar64._0_4_ * auVar66._0_4_;
  auVar220._4_4_ = local_260;
  auVar220._0_4_ = local_260;
  auVar220._8_4_ = local_260;
  auVar220._12_4_ = local_260;
  fStack_690 = local_260;
  _local_6a0 = auVar220;
  fStack_68c = local_260;
  fStack_688 = local_260;
  fStack_684 = local_260;
  auVar63 = vfmadd231ps_fma(auVar57,local_6b0,auVar220);
  auVar63 = vblendps_avx(auVar63,ZEXT816(0) << 0x40,8);
  auVar62 = vsubps_avx(auVar62,auVar63);
  auVar56 = vsubps_avx(auVar56,auVar63);
  auVar61 = vsubps_avx(auVar61,auVar63);
  auVar65 = vsubps_avx(auVar65,auVar63);
  local_700 = vbroadcastss_avx512vl(auVar62);
  auVar244 = ZEXT3264(local_700);
  auVar75._8_4_ = 1;
  auVar75._0_8_ = 0x100000001;
  auVar75._12_4_ = 1;
  auVar75._16_4_ = 1;
  auVar75._20_4_ = 1;
  auVar75._24_4_ = 1;
  auVar75._28_4_ = 1;
  local_560 = ZEXT1632(auVar62);
  local_720 = vpermps_avx512vl(auVar75,local_560);
  auVar245 = ZEXT3264(local_720);
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  local_740 = vpermps_avx2(auVar76,local_560);
  auVar239 = ZEXT3264(local_740);
  auVar77._8_4_ = 3;
  auVar77._0_8_ = 0x300000003;
  auVar77._12_4_ = 3;
  auVar77._16_4_ = 3;
  auVar77._20_4_ = 3;
  auVar77._24_4_ = 3;
  auVar77._28_4_ = 3;
  local_760 = vpermps_avx2(auVar77,local_560);
  uVar138 = auVar61._0_4_;
  local_780._4_4_ = uVar138;
  local_780._0_4_ = uVar138;
  local_780._8_4_ = uVar138;
  local_780._12_4_ = uVar138;
  local_780._16_4_ = uVar138;
  local_780._20_4_ = uVar138;
  local_780._24_4_ = uVar138;
  local_780._28_4_ = uVar138;
  auVar224 = ZEXT3264(local_780);
  local_5a0 = ZEXT1632(auVar61);
  local_7a0 = vpermps_avx2(auVar75,local_5a0);
  local_7c0 = vpermps_avx2(auVar76,local_5a0);
  auVar243 = ZEXT3264(local_7c0);
  auVar69 = vpermps_avx512vl(auVar77,local_5a0);
  auVar246 = ZEXT3264(auVar69);
  auVar229 = ZEXT3264(local_760);
  auVar70 = vbroadcastss_avx512vl(auVar56);
  local_580 = ZEXT1632(auVar56);
  auVar71 = vpermps_avx512vl(auVar75,local_580);
  auVar72 = vpermps_avx512vl(auVar76,local_580);
  auVar73 = vpermps_avx512vl(auVar77,local_580);
  auVar227 = ZEXT3264(local_7c0);
  auVar74 = vbroadcastss_avx512vl(auVar65);
  _local_5c0 = ZEXT1632(auVar65);
  auVar75 = vpermps_avx512vl(auVar75,_local_5c0);
  auVar76 = vpermps_avx512vl(auVar76,_local_5c0);
  auVar77 = vpermps_avx512vl(auVar77,_local_5c0);
  auVar62 = vmulss_avx512f(auVar58,auVar58);
  auVar69 = vfmadd231ps_avx512vl(ZEXT1632(auVar62),local_3a0,local_3a0);
  local_240 = vfmadd231ps_avx512vl(auVar69,local_380,local_380);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  auVar69._16_4_ = 0x7fffffff;
  auVar69._20_4_ = 0x7fffffff;
  auVar69._24_4_ = 0x7fffffff;
  auVar69._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar69);
  local_620 = ZEXT416((uint)local_260);
  local_260 = fVar119 - local_260;
  auVar235 = ZEXT3264(local_7a0);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  uVar47 = 0;
  bVar45 = 0;
  local_a00 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar62 = vsqrtss_avx(local_6c0,local_6c0);
  local_884 = auVar62._0_4_;
  auVar62 = vsqrtss_avx(local_6c0,local_6c0);
  local_888 = auVar62._0_4_;
  local_2f0 = ZEXT816(0x3f80000000000000);
  auVar208 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar62 = vmovshdup_avx(local_2f0);
    auVar62 = vsubps_avx(auVar62,local_2f0);
    fVar160 = auVar62._0_4_;
    fVar120 = fVar160 * 0.04761905;
    auVar185._0_4_ = local_2f0._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar192._4_4_ = fVar160;
    auVar192._0_4_ = fVar160;
    auVar192._8_4_ = fVar160;
    auVar192._12_4_ = fVar160;
    register0x000012d0 = fVar160;
    _local_820 = auVar192;
    register0x000012d4 = fVar160;
    register0x000012d8 = fVar160;
    register0x000012dc = fVar160;
    auVar62 = vfmadd231ps_fma(auVar185,_local_820,auVar208._0_32_);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar69 = vsubps_avx512vl(auVar78,ZEXT1632(auVar62));
    fVar136 = auVar62._0_4_;
    fVar154 = auVar62._4_4_;
    auVar80._4_4_ = auVar224._4_4_ * fVar154;
    auVar80._0_4_ = auVar224._0_4_ * fVar136;
    fVar156 = auVar62._8_4_;
    auVar80._8_4_ = auVar224._8_4_ * fVar156;
    fVar158 = auVar62._12_4_;
    auVar80._12_4_ = auVar224._12_4_ * fVar158;
    auVar80._16_4_ = auVar224._16_4_ * 0.0;
    auVar80._20_4_ = auVar224._20_4_ * 0.0;
    auVar80._24_4_ = auVar224._24_4_ * 0.0;
    auVar80._28_4_ = auVar185._0_4_;
    auVar81._4_4_ = auVar235._4_4_ * fVar154;
    auVar81._0_4_ = auVar235._0_4_ * fVar136;
    auVar81._8_4_ = auVar235._8_4_ * fVar156;
    auVar81._12_4_ = auVar235._12_4_ * fVar158;
    auVar81._16_4_ = auVar235._16_4_ * 0.0;
    auVar81._20_4_ = auVar235._20_4_ * 0.0;
    auVar81._24_4_ = auVar235._24_4_ * 0.0;
    auVar81._28_4_ = fVar160;
    auVar209._0_4_ = auVar227._0_4_ * fVar136;
    auVar209._4_4_ = auVar227._4_4_ * fVar154;
    auVar209._8_4_ = auVar227._8_4_ * fVar156;
    auVar209._12_4_ = auVar227._12_4_ * fVar158;
    auVar209._16_4_ = auVar227._16_4_ * 0.0;
    auVar209._20_4_ = auVar227._20_4_ * 0.0;
    auVar209._28_36_ = auVar208._28_36_;
    auVar209._24_4_ = auVar227._24_4_ * 0.0;
    local_860 = auVar246._0_32_;
    auVar79 = vmulps_avx512vl(local_860,ZEXT1632(auVar62));
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar69,auVar244._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar69,auVar245._0_32_);
    auVar61 = vfmadd231ps_fma(auVar209._0_32_,auVar69,auVar239._0_32_);
    auVar56 = vfmadd231ps_fma(auVar79,auVar69,auVar229._0_32_);
    auVar79 = vmulps_avx512vl(auVar70,ZEXT1632(auVar62));
    auVar87 = ZEXT1632(auVar62);
    auVar82 = vmulps_avx512vl(auVar71,auVar87);
    auVar83 = vmulps_avx512vl(auVar72,auVar87);
    auVar84 = vmulps_avx512vl(auVar73,auVar87);
    auVar65 = vfmadd231ps_fma(auVar79,auVar69,auVar224._0_32_);
    auVar63 = vfmadd231ps_fma(auVar82,auVar69,auVar235._0_32_);
    auVar57 = vfmadd231ps_fma(auVar83,auVar69,auVar227._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar84,auVar69,local_860);
    auVar82 = vmulps_avx512vl(auVar74,auVar87);
    auVar83 = vmulps_avx512vl(auVar75,auVar87);
    auVar84 = vmulps_avx512vl(auVar76,auVar87);
    auVar85 = vmulps_avx512vl(auVar77,auVar87);
    auVar86 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar70);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar69,auVar71);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar69,auVar72);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar69,auVar73);
    auVar208._28_36_ = auVar243._28_36_;
    auVar208._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * auVar65._12_4_,
                            CONCAT48(fVar156 * auVar65._8_4_,
                                     CONCAT44(fVar154 * auVar65._4_4_,fVar136 * auVar65._0_4_))));
    auVar82 = vmulps_avx512vl(auVar87,ZEXT1632(auVar63));
    auVar87 = vmulps_avx512vl(ZEXT1632(auVar62),ZEXT1632(auVar57));
    auVar88 = vmulps_avx512vl(ZEXT1632(auVar62),auVar79);
    auVar62 = vfmadd231ps_fma(auVar208._0_32_,auVar69,auVar80);
    auVar89 = vfmadd231ps_avx512vl(auVar82,auVar69,auVar81);
    auVar90 = vfmadd231ps_avx512vl(auVar87,auVar69,ZEXT1632(auVar61));
    auVar91 = vfmadd231ps_avx512vl(auVar88,auVar69,ZEXT1632(auVar56));
    auVar94._0_4_ = auVar86._0_4_ * fVar136;
    auVar94._4_4_ = auVar86._4_4_ * fVar154;
    auVar94._8_4_ = auVar86._8_4_ * fVar156;
    auVar94._12_4_ = auVar86._12_4_ * fVar158;
    auVar94._16_4_ = auVar86._16_4_ * 0.0;
    auVar94._20_4_ = auVar86._20_4_ * 0.0;
    auVar94._24_4_ = auVar86._24_4_ * 0.0;
    auVar94._28_4_ = 0;
    auVar82._4_4_ = auVar83._4_4_ * fVar154;
    auVar82._0_4_ = auVar83._0_4_ * fVar136;
    auVar82._8_4_ = auVar83._8_4_ * fVar156;
    auVar82._12_4_ = auVar83._12_4_ * fVar158;
    auVar82._16_4_ = auVar83._16_4_ * 0.0;
    auVar82._20_4_ = auVar83._20_4_ * 0.0;
    auVar82._24_4_ = auVar83._24_4_ * 0.0;
    auVar82._28_4_ = auVar86._28_4_;
    auVar87._4_4_ = auVar84._4_4_ * fVar154;
    auVar87._0_4_ = auVar84._0_4_ * fVar136;
    auVar87._8_4_ = auVar84._8_4_ * fVar156;
    auVar87._12_4_ = auVar84._12_4_ * fVar158;
    auVar87._16_4_ = auVar84._16_4_ * 0.0;
    auVar87._20_4_ = auVar84._20_4_ * 0.0;
    auVar87._24_4_ = auVar84._24_4_ * 0.0;
    auVar87._28_4_ = auVar83._28_4_;
    auVar88._4_4_ = auVar85._4_4_ * fVar154;
    auVar88._0_4_ = auVar85._0_4_ * fVar136;
    auVar88._8_4_ = auVar85._8_4_ * fVar156;
    auVar88._12_4_ = auVar85._12_4_ * fVar158;
    auVar88._16_4_ = auVar85._16_4_ * 0.0;
    auVar88._20_4_ = auVar85._20_4_ * 0.0;
    auVar88._24_4_ = auVar85._24_4_ * 0.0;
    auVar88._28_4_ = auVar84._28_4_;
    auVar61 = vfmadd231ps_fma(auVar94,auVar69,ZEXT1632(auVar65));
    auVar56 = vfmadd231ps_fma(auVar82,auVar69,ZEXT1632(auVar63));
    auVar65 = vfmadd231ps_fma(auVar87,auVar69,ZEXT1632(auVar57));
    auVar63 = vfmadd231ps_fma(auVar88,auVar69,auVar79);
    auVar92._28_4_ = auVar81._28_4_;
    auVar92._0_28_ =
         ZEXT1628(CONCAT412(auVar56._12_4_ * fVar158,
                            CONCAT48(auVar56._8_4_ * fVar156,
                                     CONCAT44(auVar56._4_4_ * fVar154,auVar56._0_4_ * fVar136))));
    auVar93._28_4_ = auVar80._28_4_;
    auVar93._0_28_ =
         ZEXT1628(CONCAT412(auVar65._12_4_ * fVar158,
                            CONCAT48(auVar65._8_4_ * fVar156,
                                     CONCAT44(auVar65._4_4_ * fVar154,auVar65._0_4_ * fVar136))));
    auVar57 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar158 * auVar61._12_4_,
                                                 CONCAT48(fVar156 * auVar61._8_4_,
                                                          CONCAT44(fVar154 * auVar61._4_4_,
                                                                   fVar136 * auVar61._0_4_)))),
                              auVar69,ZEXT1632(auVar62));
    auVar87 = vfmadd231ps_avx512vl(auVar92,auVar69,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar93,auVar69,auVar90);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar63._12_4_ * fVar158,
                                            CONCAT48(auVar63._8_4_ * fVar156,
                                                     CONCAT44(auVar63._4_4_ * fVar154,
                                                              auVar63._0_4_ * fVar136)))),auVar91,
                         auVar69);
    auVar69 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar62));
    auVar80 = vsubps_avx512vl(ZEXT1632(auVar56),auVar89);
    auVar81 = vsubps_avx512vl(ZEXT1632(auVar65),auVar90);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar63),auVar91);
    auVar104._0_4_ = fVar120 * auVar69._0_4_ * 3.0;
    auVar104._4_4_ = fVar120 * auVar69._4_4_ * 3.0;
    auVar104._8_4_ = fVar120 * auVar69._8_4_ * 3.0;
    auVar104._12_4_ = fVar120 * auVar69._12_4_ * 3.0;
    auVar104._16_4_ = fVar120 * auVar69._16_4_ * 3.0;
    auVar104._20_4_ = fVar120 * auVar69._20_4_ * 3.0;
    auVar104._24_4_ = fVar120 * auVar69._24_4_ * 3.0;
    auVar104._28_4_ = 0;
    auVar105._0_4_ = fVar120 * auVar80._0_4_ * 3.0;
    auVar105._4_4_ = fVar120 * auVar80._4_4_ * 3.0;
    auVar105._8_4_ = fVar120 * auVar80._8_4_ * 3.0;
    auVar105._12_4_ = fVar120 * auVar80._12_4_ * 3.0;
    auVar105._16_4_ = fVar120 * auVar80._16_4_ * 3.0;
    auVar105._20_4_ = fVar120 * auVar80._20_4_ * 3.0;
    auVar105._24_4_ = fVar120 * auVar80._24_4_ * 3.0;
    auVar105._28_4_ = 0;
    auVar89._4_4_ = fVar120 * auVar81._4_4_ * 3.0;
    auVar89._0_4_ = fVar120 * auVar81._0_4_ * 3.0;
    auVar89._8_4_ = fVar120 * auVar81._8_4_ * 3.0;
    auVar89._12_4_ = fVar120 * auVar81._12_4_ * 3.0;
    auVar89._16_4_ = fVar120 * auVar81._16_4_ * 3.0;
    auVar89._20_4_ = fVar120 * auVar81._20_4_ * 3.0;
    auVar89._24_4_ = fVar120 * auVar81._24_4_ * 3.0;
    auVar89._28_4_ = auVar85._28_4_;
    fVar136 = auVar82._0_4_ * 3.0 * fVar120;
    fVar154 = auVar82._4_4_ * 3.0 * fVar120;
    auVar90._4_4_ = fVar154;
    auVar90._0_4_ = fVar136;
    fVar156 = auVar82._8_4_ * 3.0 * fVar120;
    auVar90._8_4_ = fVar156;
    fVar158 = auVar82._12_4_ * 3.0 * fVar120;
    auVar90._12_4_ = fVar158;
    fVar160 = auVar82._16_4_ * 3.0 * fVar120;
    auVar90._16_4_ = fVar160;
    fVar162 = auVar82._20_4_ * 3.0 * fVar120;
    auVar90._20_4_ = fVar162;
    fVar164 = auVar82._24_4_ * 3.0 * fVar120;
    auVar90._24_4_ = fVar164;
    auVar90._28_4_ = fVar120;
    auVar62 = vxorps_avx512vl(auVar245._0_16_,auVar245._0_16_);
    auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar93 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar80 = ZEXT1632(auVar62);
    auVar94 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar80);
    auVar95._0_4_ = auVar79._0_4_ + fVar136;
    auVar95._4_4_ = auVar79._4_4_ + fVar154;
    auVar95._8_4_ = auVar79._8_4_ + fVar156;
    auVar95._12_4_ = auVar79._12_4_ + fVar158;
    auVar95._16_4_ = auVar79._16_4_ + fVar160;
    auVar95._20_4_ = auVar79._20_4_ + fVar162;
    auVar95._24_4_ = auVar79._24_4_ + fVar164;
    auVar95._28_4_ = auVar79._28_4_ + fVar120;
    auVar69 = vmaxps_avx(auVar79,auVar95);
    auVar83 = vminps_avx512vl(auVar79,auVar95);
    auVar84 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar80);
    auVar95 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar80);
    auVar96 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar80);
    auVar102 = ZEXT1632(auVar62);
    auVar97 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar102);
    auVar79 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,auVar102);
    auVar79 = vsubps_avx(auVar84,auVar79);
    auVar80 = vsubps_avx(auVar92,ZEXT1632(auVar57));
    auVar81 = vsubps_avx(auVar93,auVar87);
    auVar82 = vsubps_avx(auVar94,auVar88);
    auVar85 = vmulps_avx512vl(auVar81,auVar89);
    auVar85 = vfmsub231ps_avx512vl(auVar85,auVar105,auVar82);
    auVar86 = vmulps_avx512vl(auVar82,auVar104);
    auVar86 = vfmsub231ps_avx512vl(auVar86,auVar89,auVar80);
    auVar90 = vmulps_avx512vl(auVar80,auVar105);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar104,auVar81);
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    auVar86 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar86);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar85,auVar85);
    auVar86 = vmulps_avx512vl(auVar82,auVar82);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,auVar81);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar80);
    auVar90 = vrcp14ps_avx512vl(auVar86);
    auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar86,auVar78);
    auVar90 = vfmadd132ps_avx512vl(auVar91,auVar90,auVar90);
    auVar85 = vmulps_avx512vl(auVar85,auVar90);
    auVar91 = vmulps_avx512vl(auVar81,auVar97);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar96,auVar82);
    auVar98 = vmulps_avx512vl(auVar82,auVar95);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar97,auVar80);
    auVar99 = vmulps_avx512vl(auVar80,auVar96);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar95,auVar81);
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar91 = vfmadd231ps_avx512vl(auVar98,auVar91,auVar91);
    auVar90 = vmulps_avx512vl(auVar91,auVar90);
    auVar85 = vmaxps_avx512vl(auVar85,auVar90);
    auVar85 = vsqrtps_avx512vl(auVar85);
    auVar90 = vmaxps_avx512vl(auVar79,auVar84);
    auVar69 = vmaxps_avx512vl(auVar69,auVar90);
    auVar90 = vaddps_avx512vl(auVar85,auVar69);
    auVar69 = vminps_avx(auVar79,auVar84);
    auVar69 = vminps_avx512vl(auVar83,auVar69);
    auVar69 = vsubps_avx512vl(auVar69,auVar85);
    auVar79._8_4_ = 0x3f800002;
    auVar79._0_8_ = 0x3f8000023f800002;
    auVar79._12_4_ = 0x3f800002;
    auVar79._16_4_ = 0x3f800002;
    auVar79._20_4_ = 0x3f800002;
    auVar79._24_4_ = 0x3f800002;
    auVar79._28_4_ = 0x3f800002;
    auVar79 = vmulps_avx512vl(auVar90,auVar79);
    auVar83._8_4_ = 0x3f7ffffc;
    auVar83._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar83._12_4_ = 0x3f7ffffc;
    auVar83._16_4_ = 0x3f7ffffc;
    auVar83._20_4_ = 0x3f7ffffc;
    auVar83._24_4_ = 0x3f7ffffc;
    auVar83._28_4_ = 0x3f7ffffc;
    local_880 = vmulps_avx512vl(auVar69,auVar83);
    auVar69 = vmulps_avx512vl(auVar79,auVar79);
    auVar79 = vrsqrt14ps_avx512vl(auVar86);
    auVar84._8_4_ = 0xbf000000;
    auVar84._0_8_ = 0xbf000000bf000000;
    auVar84._12_4_ = 0xbf000000;
    auVar84._16_4_ = 0xbf000000;
    auVar84._20_4_ = 0xbf000000;
    auVar84._24_4_ = 0xbf000000;
    auVar84._28_4_ = 0xbf000000;
    auVar83 = vmulps_avx512vl(auVar86,auVar84);
    fVar136 = auVar79._0_4_;
    fVar154 = auVar79._4_4_;
    fVar156 = auVar79._8_4_;
    fVar158 = auVar79._12_4_;
    fVar120 = auVar79._16_4_;
    fVar160 = auVar79._20_4_;
    fVar162 = auVar79._24_4_;
    auVar91._4_4_ = fVar154 * fVar154 * fVar154 * auVar83._4_4_;
    auVar91._0_4_ = fVar136 * fVar136 * fVar136 * auVar83._0_4_;
    auVar91._8_4_ = fVar156 * fVar156 * fVar156 * auVar83._8_4_;
    auVar91._12_4_ = fVar158 * fVar158 * fVar158 * auVar83._12_4_;
    auVar91._16_4_ = fVar120 * fVar120 * fVar120 * auVar83._16_4_;
    auVar91._20_4_ = fVar160 * fVar160 * fVar160 * auVar83._20_4_;
    auVar91._24_4_ = fVar162 * fVar162 * fVar162 * auVar83._24_4_;
    auVar91._28_4_ = auVar90._28_4_;
    auVar85._8_4_ = 0x3fc00000;
    auVar85._0_8_ = 0x3fc000003fc00000;
    auVar85._12_4_ = 0x3fc00000;
    auVar85._16_4_ = 0x3fc00000;
    auVar85._20_4_ = 0x3fc00000;
    auVar85._24_4_ = 0x3fc00000;
    auVar85._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_avx512vl(auVar91,auVar79,auVar85);
    auVar243 = ZEXT3264(auVar79);
    auVar83 = vmulps_avx512vl(auVar80,auVar79);
    auVar84 = vmulps_avx512vl(auVar81,auVar79);
    auVar85 = vmulps_avx512vl(auVar82,auVar79);
    auVar206 = ZEXT1632(auVar57);
    auVar90 = vsubps_avx512vl(auVar102,auVar206);
    auVar91 = vsubps_avx512vl(auVar102,auVar87);
    auVar98 = vsubps_avx512vl(auVar102,auVar88);
    auVar86 = vmulps_avx512vl(_local_3c0,auVar98);
    auVar86 = vfmadd231ps_avx512vl(auVar86,local_3a0,auVar91);
    auVar86 = vfmadd231ps_avx512vl(auVar86,local_380,auVar90);
    auVar99 = vmulps_avx512vl(auVar98,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar90);
    auVar100 = vmulps_avx512vl(_local_3c0,auVar85);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar84,local_3a0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar83,local_380);
    auVar85 = vmulps_avx512vl(auVar98,auVar85);
    auVar84 = vfmadd231ps_avx512vl(auVar85,auVar91,auVar84);
    auVar83 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar83);
    auVar84 = vmulps_avx512vl(auVar100,auVar100);
    auVar85 = vsubps_avx512vl(local_220,auVar84);
    auVar101 = vmulps_avx512vl(auVar100,auVar83);
    auVar86 = vsubps_avx512vl(auVar86,auVar101);
    auVar101 = vaddps_avx512vl(auVar86,auVar86);
    auVar86 = vmulps_avx512vl(auVar83,auVar83);
    local_840 = vsubps_avx512vl(auVar99,auVar86);
    auVar69 = vsubps_avx512vl(local_840,auVar69);
    local_6e0 = vmulps_avx512vl(auVar101,auVar101);
    auVar86._8_4_ = 0x40800000;
    auVar86._0_8_ = 0x4080000040800000;
    auVar86._12_4_ = 0x40800000;
    auVar86._16_4_ = 0x40800000;
    auVar86._20_4_ = 0x40800000;
    auVar86._24_4_ = 0x40800000;
    auVar86._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar85,auVar86);
    auVar86 = vmulps_avx512vl(_local_4c0,auVar69);
    auVar86 = vsubps_avx512vl(local_6e0,auVar86);
    uVar54 = vcmpps_avx512vl(auVar86,auVar102,5);
    bVar43 = (byte)uVar54;
    fVar136 = (float)local_6a0._0_4_;
    fVar154 = (float)local_6a0._4_4_;
    fVar156 = fStack_698;
    fVar158 = fStack_694;
    fVar120 = fStack_690;
    fVar160 = fStack_68c;
    fVar162 = fStack_688;
    fVar164 = fStack_684;
    if (bVar43 == 0) {
LAB_01826626:
      auVar208 = ZEXT3264(_DAT_01f7b040);
      auVar245 = ZEXT3264(local_720);
      auVar244 = ZEXT3264(local_700);
      auVar239 = ZEXT3264(local_740);
      auVar235 = ZEXT3264(local_7a0);
      auVar229 = ZEXT3264(local_760);
      auVar227 = ZEXT3264(local_7c0);
      auVar224 = ZEXT3264(local_780);
    }
    else {
      auVar86 = vsqrtps_avx512vl(auVar86);
      local_640 = vaddps_avx512vl(auVar85,auVar85);
      local_660 = vrcp14ps_avx512vl(local_640);
      auVar78 = vfnmadd213ps_avx512vl(local_660,local_640,auVar78);
      auVar99 = vfmadd132ps_avx512vl(auVar78,local_660,local_660);
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar78._16_4_ = 0x80000000;
      auVar78._20_4_ = 0x80000000;
      auVar78._24_4_ = 0x80000000;
      auVar78._28_4_ = 0x80000000;
      local_500 = vxorps_avx512vl(auVar101,auVar78);
      auVar78 = vsubps_avx512vl(local_500,auVar86);
      local_4e0 = vmulps_avx512vl(auVar78,auVar99);
      auVar86 = vsubps_avx512vl(auVar86,auVar101);
      local_520 = vmulps_avx512vl(auVar86,auVar99);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar78 = vblendmps_avx512vl(auVar86,local_4e0);
      auVar102._0_4_ =
           (uint)(bVar43 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar86._0_4_;
      bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar51 * auVar78._4_4_ | (uint)!bVar51 * auVar86._4_4_;
      bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar51 * auVar78._8_4_ | (uint)!bVar51 * auVar86._8_4_;
      bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar51 * auVar78._12_4_ | (uint)!bVar51 * auVar86._12_4_;
      bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar102._16_4_ = (uint)bVar51 * auVar78._16_4_ | (uint)!bVar51 * auVar86._16_4_;
      bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar102._20_4_ = (uint)bVar51 * auVar78._20_4_ | (uint)!bVar51 * auVar86._20_4_;
      bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar102._24_4_ = (uint)bVar51 * auVar78._24_4_ | (uint)!bVar51 * auVar86._24_4_;
      bVar51 = SUB81(uVar54 >> 7,0);
      auVar102._28_4_ = (uint)bVar51 * auVar78._28_4_ | (uint)!bVar51 * auVar86._28_4_;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar78 = vblendmps_avx512vl(auVar86,local_520);
      auVar103._0_4_ =
           (uint)(bVar43 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar86._0_4_;
      bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar51 * auVar78._4_4_ | (uint)!bVar51 * auVar86._4_4_;
      bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar51 * auVar78._8_4_ | (uint)!bVar51 * auVar86._8_4_;
      bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar51 * auVar78._12_4_ | (uint)!bVar51 * auVar86._12_4_;
      bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
      auVar103._16_4_ = (uint)bVar51 * auVar78._16_4_ | (uint)!bVar51 * auVar86._16_4_;
      bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
      auVar103._20_4_ = (uint)bVar51 * auVar78._20_4_ | (uint)!bVar51 * auVar86._20_4_;
      bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
      auVar103._24_4_ = (uint)bVar51 * auVar78._24_4_ | (uint)!bVar51 * auVar86._24_4_;
      bVar51 = SUB81(uVar54 >> 7,0);
      auVar103._28_4_ = (uint)bVar51 * auVar78._28_4_ | (uint)!bVar51 * auVar86._28_4_;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar84,auVar86);
      local_680 = vmaxps_avx512vl(local_240,auVar86);
      auVar99._8_4_ = 0x36000000;
      auVar99._0_8_ = 0x3600000036000000;
      auVar99._12_4_ = 0x36000000;
      auVar99._16_4_ = 0x36000000;
      auVar99._20_4_ = 0x36000000;
      auVar99._24_4_ = 0x36000000;
      auVar99._28_4_ = 0x36000000;
      local_540 = vmulps_avx512vl(local_680,auVar99);
      vandps_avx512vl(auVar85,auVar86);
      uVar50 = vcmpps_avx512vl(local_540,local_540,1);
      uVar54 = uVar54 & uVar50;
      bVar48 = (byte)uVar54;
      if (bVar48 != 0) {
        uVar50 = vcmpps_avx512vl(auVar69,_DAT_01f7b000,2);
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar85 = vblendmps_avx512vl(auVar69,auVar84);
        bVar46 = (byte)uVar50;
        uVar55 = (uint)(bVar46 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar46 & 1) * local_540._0_4_;
        bVar51 = (bool)((byte)(uVar50 >> 1) & 1);
        uVar112 = (uint)bVar51 * auVar85._4_4_ | (uint)!bVar51 * local_540._4_4_;
        bVar51 = (bool)((byte)(uVar50 >> 2) & 1);
        uVar113 = (uint)bVar51 * auVar85._8_4_ | (uint)!bVar51 * local_540._8_4_;
        bVar51 = (bool)((byte)(uVar50 >> 3) & 1);
        uVar114 = (uint)bVar51 * auVar85._12_4_ | (uint)!bVar51 * local_540._12_4_;
        bVar51 = (bool)((byte)(uVar50 >> 4) & 1);
        uVar115 = (uint)bVar51 * auVar85._16_4_ | (uint)!bVar51 * local_540._16_4_;
        bVar51 = (bool)((byte)(uVar50 >> 5) & 1);
        uVar116 = (uint)bVar51 * auVar85._20_4_ | (uint)!bVar51 * local_540._20_4_;
        bVar51 = (bool)((byte)(uVar50 >> 6) & 1);
        uVar117 = (uint)bVar51 * auVar85._24_4_ | (uint)!bVar51 * local_540._24_4_;
        bVar51 = SUB81(uVar50 >> 7,0);
        uVar118 = (uint)bVar51 * auVar85._28_4_ | (uint)!bVar51 * local_540._28_4_;
        auVar102._0_4_ = (bVar48 & 1) * uVar55 | !(bool)(bVar48 & 1) * auVar102._0_4_;
        bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
        auVar102._4_4_ = bVar51 * uVar112 | !bVar51 * auVar102._4_4_;
        bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
        auVar102._8_4_ = bVar51 * uVar113 | !bVar51 * auVar102._8_4_;
        bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
        auVar102._12_4_ = bVar51 * uVar114 | !bVar51 * auVar102._12_4_;
        bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
        auVar102._16_4_ = bVar51 * uVar115 | !bVar51 * auVar102._16_4_;
        bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
        auVar102._20_4_ = bVar51 * uVar116 | !bVar51 * auVar102._20_4_;
        bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
        auVar102._24_4_ = bVar51 * uVar117 | !bVar51 * auVar102._24_4_;
        bVar51 = SUB81(uVar54 >> 7,0);
        auVar102._28_4_ = bVar51 * uVar118 | !bVar51 * auVar102._28_4_;
        auVar69 = vblendmps_avx512vl(auVar84,auVar69);
        bVar51 = (bool)((byte)(uVar50 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar50 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar50 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar50 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar50 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar50 >> 6) & 1);
        bVar9 = SUB81(uVar50 >> 7,0);
        auVar103._0_4_ =
             (uint)(bVar48 & 1) *
             ((uint)(bVar46 & 1) * auVar69._0_4_ | !(bool)(bVar46 & 1) * uVar55) |
             !(bool)(bVar48 & 1) * auVar103._0_4_;
        bVar3 = (bool)((byte)(uVar54 >> 1) & 1);
        auVar103._4_4_ =
             (uint)bVar3 * ((uint)bVar51 * auVar69._4_4_ | !bVar51 * uVar112) |
             !bVar3 * auVar103._4_4_;
        bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
        auVar103._8_4_ =
             (uint)bVar51 * ((uint)bVar4 * auVar69._8_4_ | !bVar4 * uVar113) |
             !bVar51 * auVar103._8_4_;
        bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
        auVar103._12_4_ =
             (uint)bVar51 * ((uint)bVar5 * auVar69._12_4_ | !bVar5 * uVar114) |
             !bVar51 * auVar103._12_4_;
        bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
        auVar103._16_4_ =
             (uint)bVar51 * ((uint)bVar6 * auVar69._16_4_ | !bVar6 * uVar115) |
             !bVar51 * auVar103._16_4_;
        bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
        auVar103._20_4_ =
             (uint)bVar51 * ((uint)bVar7 * auVar69._20_4_ | !bVar7 * uVar116) |
             !bVar51 * auVar103._20_4_;
        bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
        auVar103._24_4_ =
             (uint)bVar51 * ((uint)bVar8 * auVar69._24_4_ | !bVar8 * uVar117) |
             !bVar51 * auVar103._24_4_;
        bVar51 = SUB81(uVar54 >> 7,0);
        auVar103._28_4_ =
             (uint)bVar51 * ((uint)bVar9 * auVar69._28_4_ | !bVar9 * uVar118) |
             !bVar51 * auVar103._28_4_;
        bVar43 = (~bVar48 | bVar46) & bVar43;
      }
      if ((bVar43 & 0x7f) == 0) goto LAB_01826626;
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar84 = vxorps_avx512vl(auVar97,auVar69);
      auVar85 = vxorps_avx512vl(auVar95,auVar69);
      auVar208 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar86 = vxorps_avx512vl(auVar96,auVar69);
      auVar62 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_620._0_4_)
                              );
      auVar78 = vbroadcastss_avx512vl(auVar62);
      auVar78 = vminps_avx512vl(auVar78,auVar103);
      auVar42._4_4_ = fStack_25c;
      auVar42._0_4_ = local_260;
      auVar42._8_4_ = fStack_258;
      auVar42._12_4_ = fStack_254;
      auVar42._16_4_ = fStack_250;
      auVar42._20_4_ = fStack_24c;
      auVar42._24_4_ = fStack_248;
      auVar42._28_4_ = fStack_244;
      auVar95 = vmaxps_avx512vl(auVar42,auVar102);
      auVar96 = vmulps_avx512vl(auVar98,auVar89);
      auVar91 = vfmadd213ps_avx512vl(auVar91,auVar105,auVar96);
      auVar62 = vfmadd213ps_fma(auVar90,auVar104,auVar91);
      auVar89 = vmulps_avx512vl(_local_3c0,auVar89);
      auVar89 = vfmadd231ps_avx512vl(auVar89,local_3a0,auVar105);
      auVar89 = vfmadd231ps_avx512vl(auVar89,local_380,auVar104);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar89,auVar90);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar10 = vcmpps_avx512vl(auVar90,auVar91,1);
      auVar97 = vxorps_avx512vl(ZEXT1632(auVar62),auVar69);
      auVar98 = vrcp14ps_avx512vl(auVar89);
      auVar99 = vxorps_avx512vl(auVar89,auVar69);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = vfnmadd213ps_avx512vl(auVar98,auVar89,auVar104);
      auVar62 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
      fVar137 = auVar62._0_4_ * auVar97._0_4_;
      fVar155 = auVar62._4_4_ * auVar97._4_4_;
      auVar96._4_4_ = fVar155;
      auVar96._0_4_ = fVar137;
      fVar157 = auVar62._8_4_ * auVar97._8_4_;
      auVar96._8_4_ = fVar157;
      fVar159 = auVar62._12_4_ * auVar97._12_4_;
      auVar96._12_4_ = fVar159;
      fVar161 = auVar97._16_4_ * 0.0;
      auVar96._16_4_ = fVar161;
      fVar163 = auVar97._20_4_ * 0.0;
      auVar96._20_4_ = fVar163;
      fVar165 = auVar97._24_4_ * 0.0;
      auVar96._24_4_ = fVar165;
      auVar96._28_4_ = auVar97._28_4_;
      uVar12 = vcmpps_avx512vl(auVar89,auVar99,1);
      bVar48 = (byte)uVar10 | (byte)uVar12;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar96 = vblendmps_avx512vl(auVar96,auVar105);
      auVar106._0_4_ =
           (uint)(bVar48 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar98._0_4_;
      bVar51 = (bool)(bVar48 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar51 * auVar96._4_4_ | (uint)!bVar51 * auVar98._4_4_;
      bVar51 = (bool)(bVar48 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar51 * auVar96._8_4_ | (uint)!bVar51 * auVar98._8_4_;
      bVar51 = (bool)(bVar48 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar51 * auVar96._12_4_ | (uint)!bVar51 * auVar98._12_4_;
      bVar51 = (bool)(bVar48 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar51 * auVar96._16_4_ | (uint)!bVar51 * auVar98._16_4_;
      bVar51 = (bool)(bVar48 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar51 * auVar96._20_4_ | (uint)!bVar51 * auVar98._20_4_;
      bVar51 = (bool)(bVar48 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar51 * auVar96._24_4_ | (uint)!bVar51 * auVar98._24_4_;
      auVar106._28_4_ =
           (uint)(bVar48 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar48 >> 7) * auVar98._28_4_;
      auVar96 = vmaxps_avx512vl(auVar95,auVar106);
      uVar12 = vcmpps_avx512vl(auVar89,auVar99,6);
      bVar48 = (byte)uVar10 | (byte)uVar12;
      auVar98._0_4_ = (uint)(bVar48 & 1) * 0x7f800000 | (uint)!(bool)(bVar48 & 1) * (int)fVar137;
      bVar51 = (bool)(bVar48 >> 1 & 1);
      auVar98._4_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar155;
      bVar51 = (bool)(bVar48 >> 2 & 1);
      auVar98._8_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar157;
      bVar51 = (bool)(bVar48 >> 3 & 1);
      auVar98._12_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar159;
      bVar51 = (bool)(bVar48 >> 4 & 1);
      auVar98._16_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar161;
      bVar51 = (bool)(bVar48 >> 5 & 1);
      auVar98._20_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar163;
      bVar51 = (bool)(bVar48 >> 6 & 1);
      auVar98._24_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar165;
      auVar98._28_4_ =
           (uint)(bVar48 >> 7) * 0x7f800000 | (uint)!(bool)(bVar48 >> 7) * auVar97._28_4_;
      auVar89 = vminps_avx512vl(auVar78,auVar98);
      auVar62 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar62),auVar92);
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar62),auVar93);
      auVar95 = ZEXT1632(auVar62);
      auVar78 = vsubps_avx512vl(auVar95,auVar94);
      auVar78 = vmulps_avx512vl(auVar78,auVar84);
      auVar93 = vfmadd231ps_avx512vl(auVar78,auVar86,auVar93);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar85,auVar92);
      auVar84 = vmulps_avx512vl(_local_3c0,auVar84);
      auVar84 = vfmadd231ps_avx512vl(auVar84,local_3a0,auVar86);
      auVar84 = vfmadd231ps_avx512vl(auVar84,local_380,auVar85);
      vandps_avx512vl(auVar84,auVar90);
      uVar10 = vcmpps_avx512vl(auVar84,auVar91,1);
      auVar85 = vxorps_avx512vl(auVar92,auVar69);
      auVar86 = vrcp14ps_avx512vl(auVar84);
      auVar69 = vxorps_avx512vl(auVar84,auVar69);
      auVar92 = vfnmadd213ps_avx512vl(auVar86,auVar84,auVar104);
      auVar62 = vfmadd132ps_fma(auVar92,auVar86,auVar86);
      fVar137 = auVar62._0_4_ * auVar85._0_4_;
      fVar155 = auVar62._4_4_ * auVar85._4_4_;
      auVar97._4_4_ = fVar155;
      auVar97._0_4_ = fVar137;
      fVar157 = auVar62._8_4_ * auVar85._8_4_;
      auVar97._8_4_ = fVar157;
      fVar159 = auVar62._12_4_ * auVar85._12_4_;
      auVar97._12_4_ = fVar159;
      fVar161 = auVar85._16_4_ * 0.0;
      auVar97._16_4_ = fVar161;
      fVar163 = auVar85._20_4_ * 0.0;
      auVar97._20_4_ = fVar163;
      fVar165 = auVar85._24_4_ * 0.0;
      auVar97._24_4_ = fVar165;
      auVar97._28_4_ = auVar85._28_4_;
      uVar12 = vcmpps_avx512vl(auVar84,auVar69,1);
      bVar48 = (byte)uVar10 | (byte)uVar12;
      auVar92 = vblendmps_avx512vl(auVar97,auVar105);
      auVar107._0_4_ =
           (uint)(bVar48 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar86._0_4_;
      bVar51 = (bool)(bVar48 >> 1 & 1);
      auVar107._4_4_ = (uint)bVar51 * auVar92._4_4_ | (uint)!bVar51 * auVar86._4_4_;
      bVar51 = (bool)(bVar48 >> 2 & 1);
      auVar107._8_4_ = (uint)bVar51 * auVar92._8_4_ | (uint)!bVar51 * auVar86._8_4_;
      bVar51 = (bool)(bVar48 >> 3 & 1);
      auVar107._12_4_ = (uint)bVar51 * auVar92._12_4_ | (uint)!bVar51 * auVar86._12_4_;
      bVar51 = (bool)(bVar48 >> 4 & 1);
      auVar107._16_4_ = (uint)bVar51 * auVar92._16_4_ | (uint)!bVar51 * auVar86._16_4_;
      bVar51 = (bool)(bVar48 >> 5 & 1);
      auVar107._20_4_ = (uint)bVar51 * auVar92._20_4_ | (uint)!bVar51 * auVar86._20_4_;
      bVar51 = (bool)(bVar48 >> 6 & 1);
      auVar107._24_4_ = (uint)bVar51 * auVar92._24_4_ | (uint)!bVar51 * auVar86._24_4_;
      auVar107._28_4_ =
           (uint)(bVar48 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar48 >> 7) * auVar86._28_4_;
      local_360 = vmaxps_avx(auVar96,auVar107);
      uVar12 = vcmpps_avx512vl(auVar84,auVar69,6);
      bVar48 = (byte)uVar10 | (byte)uVar12;
      auVar108._0_4_ = (uint)(bVar48 & 1) * 0x7f800000 | (uint)!(bool)(bVar48 & 1) * (int)fVar137;
      bVar51 = (bool)(bVar48 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar155;
      bVar51 = (bool)(bVar48 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar157;
      bVar51 = (bool)(bVar48 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar159;
      bVar51 = (bool)(bVar48 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar161;
      bVar51 = (bool)(bVar48 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar163;
      bVar51 = (bool)(bVar48 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar51 * 0x7f800000 | (uint)!bVar51 * (int)fVar165;
      auVar108._28_4_ =
           (uint)(bVar48 >> 7) * 0x7f800000 | (uint)!(bool)(bVar48 >> 7) * auVar85._28_4_;
      local_2a0 = vminps_avx(auVar89,auVar108);
      uVar10 = vcmpps_avx512vl(local_360,local_2a0,2);
      bVar43 = bVar43 & 0x7f & (byte)uVar10;
      if (bVar43 == 0) {
        auVar246 = ZEXT3264(local_860);
        goto LAB_01826626;
      }
      auVar84 = vmaxps_avx512vl(auVar95,local_880);
      auVar69 = vfmadd213ps_avx512vl(local_4e0,auVar100,auVar83);
      fVar137 = auVar79._0_4_;
      fVar155 = auVar79._4_4_;
      auVar30._4_4_ = fVar155 * auVar69._4_4_;
      auVar30._0_4_ = fVar137 * auVar69._0_4_;
      fVar157 = auVar79._8_4_;
      auVar30._8_4_ = fVar157 * auVar69._8_4_;
      fVar159 = auVar79._12_4_;
      auVar30._12_4_ = fVar159 * auVar69._12_4_;
      fVar161 = auVar79._16_4_;
      auVar30._16_4_ = fVar161 * auVar69._16_4_;
      fVar163 = auVar79._20_4_;
      auVar30._20_4_ = fVar163 * auVar69._20_4_;
      fVar165 = auVar79._24_4_;
      auVar30._24_4_ = fVar165 * auVar69._24_4_;
      auVar30._28_4_ = auVar69._28_4_;
      auVar69 = vfmadd213ps_avx512vl(local_520,auVar100,auVar83);
      auVar31._4_4_ = fVar155 * auVar69._4_4_;
      auVar31._0_4_ = fVar137 * auVar69._0_4_;
      auVar31._8_4_ = fVar157 * auVar69._8_4_;
      auVar31._12_4_ = fVar159 * auVar69._12_4_;
      auVar31._16_4_ = fVar161 * auVar69._16_4_;
      auVar31._20_4_ = fVar163 * auVar69._20_4_;
      auVar31._24_4_ = fVar165 * auVar69._24_4_;
      auVar31._28_4_ = auVar69._28_4_;
      auVar69 = vminps_avx512vl(auVar30,auVar104);
      auVar39 = ZEXT812(0);
      auVar85 = ZEXT1232(auVar39) << 0x20;
      auVar69 = vmaxps_avx(auVar69,ZEXT1232(auVar39) << 0x20);
      auVar86 = vminps_avx512vl(auVar31,auVar104);
      auVar32._4_4_ = (auVar69._4_4_ + 1.0) * 0.125;
      auVar32._0_4_ = (auVar69._0_4_ + 0.0) * 0.125;
      auVar32._8_4_ = (auVar69._8_4_ + 2.0) * 0.125;
      auVar32._12_4_ = (auVar69._12_4_ + 3.0) * 0.125;
      auVar32._16_4_ = (auVar69._16_4_ + 4.0) * 0.125;
      auVar32._20_4_ = (auVar69._20_4_ + 5.0) * 0.125;
      auVar32._24_4_ = (auVar69._24_4_ + 6.0) * 0.125;
      auVar32._28_4_ = auVar69._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar32,_local_820,auVar185);
      auVar69 = vmaxps_avx(auVar86,ZEXT1232(auVar39) << 0x20);
      auVar33._4_4_ = (auVar69._4_4_ + 1.0) * 0.125;
      auVar33._0_4_ = (auVar69._0_4_ + 0.0) * 0.125;
      auVar33._8_4_ = (auVar69._8_4_ + 2.0) * 0.125;
      auVar33._12_4_ = (auVar69._12_4_ + 3.0) * 0.125;
      auVar33._16_4_ = (auVar69._16_4_ + 4.0) * 0.125;
      auVar33._20_4_ = (auVar69._20_4_ + 5.0) * 0.125;
      auVar33._24_4_ = (auVar69._24_4_ + 6.0) * 0.125;
      auVar33._28_4_ = auVar69._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar33,_local_820,auVar185);
      auVar34._4_4_ = auVar84._4_4_ * auVar84._4_4_;
      auVar34._0_4_ = auVar84._0_4_ * auVar84._0_4_;
      auVar34._8_4_ = auVar84._8_4_ * auVar84._8_4_;
      auVar34._12_4_ = auVar84._12_4_ * auVar84._12_4_;
      auVar34._16_4_ = auVar84._16_4_ * auVar84._16_4_;
      auVar34._20_4_ = auVar84._20_4_ * auVar84._20_4_;
      auVar34._24_4_ = auVar84._24_4_ * auVar84._24_4_;
      auVar34._28_4_ = auVar84._28_4_;
      auVar69 = vsubps_avx(local_840,auVar34);
      auVar35._4_4_ = auVar69._4_4_ * (float)local_4c0._4_4_;
      auVar35._0_4_ = auVar69._0_4_ * (float)local_4c0._0_4_;
      auVar35._8_4_ = auVar69._8_4_ * fStack_4b8;
      auVar35._12_4_ = auVar69._12_4_ * fStack_4b4;
      auVar35._16_4_ = auVar69._16_4_ * fStack_4b0;
      auVar35._20_4_ = auVar69._20_4_ * fStack_4ac;
      auVar35._24_4_ = auVar69._24_4_ * fStack_4a8;
      auVar35._28_4_ = auVar84._28_4_;
      auVar84 = vsubps_avx(local_6e0,auVar35);
      uVar10 = vcmpps_avx512vl(auVar84,ZEXT1232(auVar39) << 0x20,5);
      bVar48 = (byte)uVar10;
      auVar246 = ZEXT3264(local_860);
      if (bVar48 == 0) {
        bVar48 = 0;
        auVar79 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar224 = ZEXT864(0) << 0x20;
        auVar84 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar86 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar233 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar100._8_4_ = 0x7f800000;
        auVar100._0_8_ = 0x7f8000007f800000;
        auVar100._12_4_ = 0x7f800000;
        auVar100._16_4_ = 0x7f800000;
        auVar100._20_4_ = 0x7f800000;
        auVar100._24_4_ = 0x7f800000;
        auVar100._28_4_ = 0x7f800000;
        auVar101._8_4_ = 0xff800000;
        auVar101._0_8_ = 0xff800000ff800000;
        auVar101._12_4_ = 0xff800000;
        auVar101._16_4_ = 0xff800000;
        auVar101._20_4_ = 0xff800000;
        auVar101._24_4_ = 0xff800000;
        auVar101._28_4_ = 0xff800000;
      }
      else {
        auVar61 = vxorps_avx512vl(auVar192,auVar192);
        uVar54 = vcmpps_avx512vl(auVar84,auVar95,5);
        auVar84 = vsqrtps_avx(auVar84);
        auVar85 = vfnmadd213ps_avx512vl(local_640,local_660,auVar104);
        auVar62 = vfmadd132ps_fma(auVar85,local_660,local_660);
        auVar85 = vsubps_avx(local_500,auVar84);
        auVar36._4_4_ = auVar62._4_4_ * auVar85._4_4_;
        auVar36._0_4_ = auVar62._0_4_ * auVar85._0_4_;
        auVar36._8_4_ = auVar62._8_4_ * auVar85._8_4_;
        auVar36._12_4_ = auVar62._12_4_ * auVar85._12_4_;
        auVar36._16_4_ = auVar85._16_4_ * 0.0;
        auVar36._20_4_ = auVar85._20_4_ * 0.0;
        auVar36._24_4_ = auVar85._24_4_ * 0.0;
        auVar36._28_4_ = 0x3e000000;
        auVar84 = vsubps_avx512vl(auVar84,auVar101);
        auVar37._4_4_ = auVar62._4_4_ * auVar84._4_4_;
        auVar37._0_4_ = auVar62._0_4_ * auVar84._0_4_;
        auVar37._8_4_ = auVar62._8_4_ * auVar84._8_4_;
        auVar37._12_4_ = auVar62._12_4_ * auVar84._12_4_;
        auVar37._16_4_ = auVar84._16_4_ * 0.0;
        auVar37._20_4_ = auVar84._20_4_ * 0.0;
        auVar37._24_4_ = auVar84._24_4_ * 0.0;
        auVar37._28_4_ = auVar185._0_4_;
        auVar84 = vfmadd213ps_avx512vl(auVar100,auVar36,auVar83);
        auVar234._0_4_ = fVar137 * auVar84._0_4_;
        auVar234._4_4_ = fVar155 * auVar84._4_4_;
        auVar234._8_4_ = fVar157 * auVar84._8_4_;
        auVar234._12_4_ = fVar159 * auVar84._12_4_;
        auVar234._16_4_ = fVar161 * auVar84._16_4_;
        auVar234._20_4_ = fVar163 * auVar84._20_4_;
        auVar234._24_4_ = fVar165 * auVar84._24_4_;
        auVar234._28_4_ = 0;
        auVar84 = vmulps_avx512vl(local_380,auVar36);
        auVar85 = vmulps_avx512vl(local_3a0,auVar36);
        auVar92 = vmulps_avx512vl(_local_3c0,auVar36);
        auVar86 = vfmadd213ps_avx512vl(auVar80,auVar234,auVar206);
        auVar84 = vsubps_avx512vl(auVar84,auVar86);
        auVar86 = vfmadd213ps_avx512vl(auVar81,auVar234,auVar87);
        auVar86 = vsubps_avx512vl(auVar85,auVar86);
        auVar62 = vfmadd213ps_fma(auVar234,auVar82,auVar88);
        auVar85 = vsubps_avx(auVar92,ZEXT1632(auVar62));
        auVar233 = auVar85._0_28_;
        auVar83 = vfmadd213ps_avx512vl(auVar100,auVar37,auVar83);
        auVar83 = vmulps_avx512vl(auVar79,auVar83);
        auVar243 = ZEXT3264(auVar83);
        auVar79 = vmulps_avx512vl(local_380,auVar37);
        auVar92 = vmulps_avx512vl(local_3a0,auVar37);
        auVar93 = vmulps_avx512vl(_local_3c0,auVar37);
        auVar62 = vfmadd213ps_fma(auVar80,auVar83,auVar206);
        auVar85 = vsubps_avx(auVar79,ZEXT1632(auVar62));
        auVar62 = vfmadd213ps_fma(auVar81,auVar83,auVar87);
        auVar79 = vsubps_avx512vl(auVar92,ZEXT1632(auVar62));
        auVar62 = vfmadd213ps_fma(auVar82,auVar83,auVar88);
        auVar80 = vsubps_avx512vl(auVar93,ZEXT1632(auVar62));
        auVar224 = ZEXT3264(auVar80);
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar80 = vblendmps_avx512vl(auVar186,auVar36);
        bVar51 = (bool)((byte)uVar54 & 1);
        auVar100._0_4_ = (uint)bVar51 * auVar80._0_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
        auVar100._4_4_ = (uint)bVar51 * auVar80._4_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
        auVar100._8_4_ = (uint)bVar51 * auVar80._8_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
        auVar100._12_4_ = (uint)bVar51 * auVar80._12_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
        auVar100._16_4_ = (uint)bVar51 * auVar80._16_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
        auVar100._20_4_ = (uint)bVar51 * auVar80._20_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
        auVar100._24_4_ = (uint)bVar51 * auVar80._24_4_ | (uint)!bVar51 * 0x7f800000;
        bVar51 = SUB81(uVar54 >> 7,0);
        auVar100._28_4_ = (uint)bVar51 * auVar80._28_4_ | (uint)!bVar51 * 0x7f800000;
        auVar207._8_4_ = 0xff800000;
        auVar207._0_8_ = 0xff800000ff800000;
        auVar207._12_4_ = 0xff800000;
        auVar207._16_4_ = 0xff800000;
        auVar207._20_4_ = 0xff800000;
        auVar207._24_4_ = 0xff800000;
        auVar207._28_4_ = 0xff800000;
        auVar80 = vblendmps_avx512vl(auVar207,auVar37);
        bVar51 = (bool)((byte)uVar54 & 1);
        auVar101._0_4_ = (uint)bVar51 * auVar80._0_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar51 * auVar80._4_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar51 * auVar80._8_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar51 * auVar80._12_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
        auVar101._16_4_ = (uint)bVar51 * auVar80._16_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
        auVar101._20_4_ = (uint)bVar51 * auVar80._20_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
        auVar101._24_4_ = (uint)bVar51 * auVar80._24_4_ | (uint)!bVar51 * -0x800000;
        bVar51 = SUB81(uVar54 >> 7,0);
        auVar101._28_4_ = (uint)bVar51 * auVar80._28_4_ | (uint)!bVar51 * -0x800000;
        auVar206._8_4_ = 0x36000000;
        auVar206._0_8_ = 0x3600000036000000;
        auVar206._12_4_ = 0x36000000;
        auVar206._16_4_ = 0x36000000;
        auVar206._20_4_ = 0x36000000;
        auVar206._24_4_ = 0x36000000;
        auVar206._28_4_ = 0x36000000;
        auVar80 = vmulps_avx512vl(local_680,auVar206);
        uVar50 = vcmpps_avx512vl(auVar80,local_540,0xe);
        uVar54 = uVar54 & uVar50;
        bVar46 = (byte)uVar54;
        if (bVar46 != 0) {
          uVar50 = vcmpps_avx512vl(auVar69,ZEXT1632(auVar61),2);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar69 = vblendmps_avx512vl(auVar228,auVar236);
          bVar44 = (byte)uVar50;
          uVar55 = (uint)(bVar44 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar80._0_4_;
          bVar51 = (bool)((byte)(uVar50 >> 1) & 1);
          uVar112 = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * auVar80._4_4_;
          bVar51 = (bool)((byte)(uVar50 >> 2) & 1);
          uVar113 = (uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * auVar80._8_4_;
          bVar51 = (bool)((byte)(uVar50 >> 3) & 1);
          uVar114 = (uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * auVar80._12_4_;
          bVar51 = (bool)((byte)(uVar50 >> 4) & 1);
          uVar115 = (uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * auVar80._16_4_;
          bVar51 = (bool)((byte)(uVar50 >> 5) & 1);
          uVar116 = (uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * auVar80._20_4_;
          bVar51 = (bool)((byte)(uVar50 >> 6) & 1);
          uVar117 = (uint)bVar51 * auVar69._24_4_ | (uint)!bVar51 * auVar80._24_4_;
          bVar51 = SUB81(uVar50 >> 7,0);
          uVar118 = (uint)bVar51 * auVar69._28_4_ | (uint)!bVar51 * auVar80._28_4_;
          auVar100._0_4_ = (bVar46 & 1) * uVar55 | !(bool)(bVar46 & 1) * auVar100._0_4_;
          bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
          auVar100._4_4_ = bVar51 * uVar112 | !bVar51 * auVar100._4_4_;
          bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
          auVar100._8_4_ = bVar51 * uVar113 | !bVar51 * auVar100._8_4_;
          bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
          auVar100._12_4_ = bVar51 * uVar114 | !bVar51 * auVar100._12_4_;
          bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
          auVar100._16_4_ = bVar51 * uVar115 | !bVar51 * auVar100._16_4_;
          bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
          auVar100._20_4_ = bVar51 * uVar116 | !bVar51 * auVar100._20_4_;
          bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
          auVar100._24_4_ = bVar51 * uVar117 | !bVar51 * auVar100._24_4_;
          bVar51 = SUB81(uVar54 >> 7,0);
          auVar100._28_4_ = bVar51 * uVar118 | !bVar51 * auVar100._28_4_;
          auVar69 = vblendmps_avx512vl(auVar236,auVar228);
          bVar51 = (bool)((byte)(uVar50 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar50 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar50 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar50 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar50 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar50 >> 6) & 1);
          bVar9 = SUB81(uVar50 >> 7,0);
          auVar101._0_4_ =
               (uint)(bVar46 & 1) *
               ((uint)(bVar44 & 1) * auVar69._0_4_ | !(bool)(bVar44 & 1) * uVar55) |
               !(bool)(bVar46 & 1) * auVar101._0_4_;
          bVar3 = (bool)((byte)(uVar54 >> 1) & 1);
          auVar101._4_4_ =
               (uint)bVar3 * ((uint)bVar51 * auVar69._4_4_ | !bVar51 * uVar112) |
               !bVar3 * auVar101._4_4_;
          bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
          auVar101._8_4_ =
               (uint)bVar51 * ((uint)bVar4 * auVar69._8_4_ | !bVar4 * uVar113) |
               !bVar51 * auVar101._8_4_;
          bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
          auVar101._12_4_ =
               (uint)bVar51 * ((uint)bVar5 * auVar69._12_4_ | !bVar5 * uVar114) |
               !bVar51 * auVar101._12_4_;
          bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
          auVar101._16_4_ =
               (uint)bVar51 * ((uint)bVar6 * auVar69._16_4_ | !bVar6 * uVar115) |
               !bVar51 * auVar101._16_4_;
          bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
          auVar101._20_4_ =
               (uint)bVar51 * ((uint)bVar7 * auVar69._20_4_ | !bVar7 * uVar116) |
               !bVar51 * auVar101._20_4_;
          bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
          auVar101._24_4_ =
               (uint)bVar51 * ((uint)bVar8 * auVar69._24_4_ | !bVar8 * uVar117) |
               !bVar51 * auVar101._24_4_;
          bVar51 = SUB81(uVar54 >> 7,0);
          auVar101._28_4_ =
               (uint)bVar51 * ((uint)bVar9 * auVar69._28_4_ | !bVar9 * uVar118) |
               !bVar51 * auVar101._28_4_;
          bVar48 = (~bVar46 | bVar44) & bVar48;
        }
      }
      auVar227._0_4_ = (float)local_3c0._0_4_ * auVar224._0_4_;
      auVar227._4_4_ = (float)local_3c0._4_4_ * auVar224._4_4_;
      auVar227._8_4_ = fStack_3b8 * auVar224._8_4_;
      auVar227._12_4_ = fStack_3b4 * auVar224._12_4_;
      auVar227._16_4_ = fStack_3b0 * auVar224._16_4_;
      auVar227._20_4_ = fStack_3ac * auVar224._20_4_;
      auVar227._28_36_ = auVar224._28_36_;
      auVar227._24_4_ = fStack_3a8 * auVar224._24_4_;
      auVar62 = vfmadd231ps_fma(auVar227._0_32_,local_3a0,auVar79);
      auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),local_380,auVar85);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar226._16_4_ = 0x7fffffff;
      auVar226._20_4_ = 0x7fffffff;
      auVar226._24_4_ = 0x7fffffff;
      auVar226._28_4_ = 0x7fffffff;
      auVar69 = vandps_avx(ZEXT1632(auVar62),auVar226);
      _local_1c0 = local_360;
      auVar223._8_4_ = 0x3e99999a;
      auVar223._0_8_ = 0x3e99999a3e99999a;
      auVar223._12_4_ = 0x3e99999a;
      auVar223._16_4_ = 0x3e99999a;
      auVar223._20_4_ = 0x3e99999a;
      auVar223._24_4_ = 0x3e99999a;
      auVar223._28_4_ = 0x3e99999a;
      uVar10 = vcmpps_avx512vl(auVar69,auVar223,1);
      _local_2c0 = vmaxps_avx(local_360,auVar101);
      auVar69 = vminps_avx(local_2a0,auVar100);
      uVar12 = vcmpps_avx512vl(local_360,auVar69,2);
      bVar46 = (byte)uVar12 & bVar43;
      _local_340 = _local_2c0;
      uVar11 = vcmpps_avx512vl(_local_2c0,local_2a0,2);
      if ((bVar43 & ((byte)uVar11 | (byte)uVar12)) == 0) {
        auVar208 = ZEXT3264(_DAT_01f7b040);
        auVar244 = ZEXT3264(local_700);
        auVar245 = ZEXT3264(local_720);
        auVar239 = ZEXT3264(local_740);
        auVar229 = ZEXT3264(local_760);
        auVar224 = ZEXT3264(local_780);
        auVar235 = ZEXT3264(local_7a0);
        auVar227 = ZEXT3264(local_7c0);
      }
      else {
        local_890 = (uint)(byte)((byte)uVar10 | ~bVar48);
        auVar38._4_4_ = (float)local_3c0._4_4_ * auVar233._4_4_;
        auVar38._0_4_ = (float)local_3c0._0_4_ * auVar233._0_4_;
        auVar38._8_4_ = fStack_3b8 * auVar233._8_4_;
        auVar38._12_4_ = fStack_3b4 * auVar233._12_4_;
        auVar38._16_4_ = fStack_3b0 * auVar233._16_4_;
        auVar38._20_4_ = fStack_3ac * auVar233._20_4_;
        auVar38._24_4_ = fStack_3a8 * auVar233._24_4_;
        auVar38._28_4_ = auVar69._28_4_;
        auVar62 = vfmadd213ps_fma(auVar86,local_3a0,auVar38);
        auVar62 = vfmadd213ps_fma(auVar84,local_380,ZEXT1632(auVar62));
        auVar69 = vandps_avx(ZEXT1632(auVar62),auVar226);
        uVar10 = vcmpps_avx512vl(auVar69,auVar223,1);
        bVar48 = (byte)uVar10 | ~bVar48;
        auVar131._8_4_ = 2;
        auVar131._0_8_ = 0x200000002;
        auVar131._12_4_ = 2;
        auVar131._16_4_ = 2;
        auVar131._20_4_ = 2;
        auVar131._24_4_ = 2;
        auVar131._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar69 = vpblendmd_avx512vl(auVar131,auVar27);
        local_280._0_4_ = (uint)(bVar48 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar48 & 1) * 2;
        bVar51 = (bool)(bVar48 >> 1 & 1);
        local_280._4_4_ = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)(bVar48 >> 2 & 1);
        local_280._8_4_ = (uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)(bVar48 >> 3 & 1);
        local_280._12_4_ = (uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)(bVar48 >> 4 & 1);
        local_280._16_4_ = (uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)(bVar48 >> 5 & 1);
        local_280._20_4_ = (uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)(bVar48 >> 6 & 1);
        local_280._24_4_ = (uint)bVar51 * auVar69._24_4_ | (uint)!bVar51 * 2;
        local_280._28_4_ = (uint)(bVar48 >> 7) * auVar69._28_4_ | (uint)!(bool)(bVar48 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar10 = vpcmpd_avx512vl(local_2e0,local_280,5);
        local_88c = (uint)bVar46;
        local_320 = local_360._0_4_ + (float)local_6a0._0_4_;
        fStack_31c = local_360._4_4_ + (float)local_6a0._4_4_;
        fStack_318 = local_360._8_4_ + fStack_698;
        fStack_314 = local_360._12_4_ + fStack_694;
        fStack_310 = local_360._16_4_ + fStack_690;
        fStack_30c = local_360._20_4_ + fStack_68c;
        fStack_308 = local_360._24_4_ + fStack_688;
        fStack_304 = local_360._28_4_ + fStack_684;
        for (bVar46 = (byte)uVar10 & bVar46; bVar46 != 0; bVar46 = ~bVar48 & bVar46 & (byte)uVar10)
        {
          auVar132._8_4_ = 0x7f800000;
          auVar132._0_8_ = 0x7f8000007f800000;
          auVar132._12_4_ = 0x7f800000;
          auVar132._16_4_ = 0x7f800000;
          auVar132._20_4_ = 0x7f800000;
          auVar132._24_4_ = 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar69 = vblendmps_avx512vl(auVar132,local_360);
          auVar110._0_4_ =
               (uint)(bVar46 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar46 & 1) * 0x7f800000;
          bVar51 = (bool)(bVar46 >> 1 & 1);
          auVar110._4_4_ = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar46 >> 2 & 1);
          auVar110._8_4_ = (uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar46 >> 3 & 1);
          auVar110._12_4_ = (uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar46 >> 4 & 1);
          auVar110._16_4_ = (uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar46 >> 5 & 1);
          auVar110._20_4_ = (uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * 0x7f800000;
          auVar110._24_4_ =
               (uint)(bVar46 >> 6) * auVar69._24_4_ | (uint)!(bool)(bVar46 >> 6) * 0x7f800000;
          auVar110._28_4_ = 0x7f800000;
          auVar69 = vshufps_avx(auVar110,auVar110,0xb1);
          auVar69 = vminps_avx(auVar110,auVar69);
          auVar79 = vshufpd_avx(auVar69,auVar69,5);
          auVar69 = vminps_avx(auVar69,auVar79);
          auVar79 = vpermpd_avx2(auVar69,0x4e);
          auVar69 = vminps_avx(auVar69,auVar79);
          uVar10 = vcmpps_avx512vl(auVar110,auVar69,0);
          bVar44 = (byte)uVar10 & bVar46;
          bVar48 = bVar46;
          if (bVar44 != 0) {
            bVar48 = bVar44;
          }
          iVar13 = 0;
          for (uVar55 = (uint)bVar48; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
            iVar13 = iVar13 + 1;
          }
          bVar48 = '\x01' << ((byte)iVar13 & 0x1f);
          auVar208 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar13 << 2)));
          fVar154 = local_888;
          fVar136 = *(float *)(local_1e0 + (uint)(iVar13 << 2));
          uVar138 = 0;
          uVar230 = 0;
          uVar231 = 0;
          if ((float)local_6c0._0_4_ < 0.0) {
            local_840._0_16_ = ZEXT416((uint)*(float *)(local_1e0 + (uint)(iVar13 << 2)));
            local_6e0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar13 << 2)));
            auVar243 = ZEXT1664(auVar243._0_16_);
            fVar154 = sqrtf((float)local_6c0._0_4_);
            auVar208 = ZEXT1664(local_6e0._0_16_);
            auVar246 = ZEXT3264(local_860);
            fVar136 = (float)local_840._0_4_;
            uVar138 = local_840._4_4_;
            uVar230 = local_840._8_4_;
            uVar231 = local_840._12_4_;
          }
          uVar54 = (ulong)bVar48;
          auVar61 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar62 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar56 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar65 = vminps_avx(auVar61,auVar56);
          auVar61 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar56 = vmaxps_avx(auVar62,auVar61);
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx(auVar65,auVar193);
          auVar61 = vandps_avx(auVar56,auVar193);
          auVar62 = vmaxps_avx(auVar62,auVar61);
          auVar61 = vmovshdup_avx(auVar62);
          auVar61 = vmaxss_avx(auVar61,auVar62);
          auVar62 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vmaxss_avx(auVar62,auVar61);
          local_540._0_4_ = auVar62._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar56,auVar56,0xff);
          uVar50 = 0;
          while( true ) {
            auVar69 = local_840;
            bVar44 = (byte)uVar54;
            if (uVar50 == 5) break;
            uVar232 = auVar208._0_4_;
            auVar124._4_4_ = uVar232;
            auVar124._0_4_ = uVar232;
            auVar124._8_4_ = uVar232;
            auVar124._12_4_ = uVar232;
            auVar61 = vfmadd132ps_fma(auVar124,ZEXT816(0) << 0x40,local_6b0);
            fVar156 = 1.0 - fVar136;
            auVar167._0_4_ = local_5a0._0_4_ * fVar136;
            auVar167._4_4_ = local_5a0._4_4_ * fVar136;
            auVar167._8_4_ = local_5a0._8_4_ * fVar136;
            auVar167._12_4_ = local_5a0._12_4_ * fVar136;
            local_4e0._0_16_ = ZEXT416((uint)fVar156);
            auVar194._4_4_ = fVar156;
            auVar194._0_4_ = fVar156;
            auVar194._8_4_ = fVar156;
            auVar194._12_4_ = fVar156;
            auVar62 = vfmadd231ps_fma(auVar167,auVar194,local_560._0_16_);
            auVar200._0_4_ = local_580._0_4_ * fVar136;
            auVar200._4_4_ = local_580._4_4_ * fVar136;
            auVar200._8_4_ = local_580._8_4_ * fVar136;
            auVar200._12_4_ = local_580._12_4_ * fVar136;
            auVar56 = vfmadd231ps_fma(auVar200,auVar194,local_5a0._0_16_);
            auVar213._0_4_ = fVar136 * (float)local_5c0._0_4_;
            auVar213._4_4_ = fVar136 * (float)local_5c0._4_4_;
            auVar213._8_4_ = fVar136 * fStack_5b8;
            auVar213._12_4_ = fVar136 * fStack_5b4;
            auVar65 = vfmadd231ps_fma(auVar213,auVar194,local_580._0_16_);
            auVar221._0_4_ = fVar136 * auVar56._0_4_;
            auVar221._4_4_ = fVar136 * auVar56._4_4_;
            auVar221._8_4_ = fVar136 * auVar56._8_4_;
            auVar221._12_4_ = fVar136 * auVar56._12_4_;
            auVar62 = vfmadd231ps_fma(auVar221,auVar194,auVar62);
            auVar168._0_4_ = fVar136 * auVar65._0_4_;
            auVar168._4_4_ = fVar136 * auVar65._4_4_;
            auVar168._8_4_ = fVar136 * auVar65._8_4_;
            auVar168._12_4_ = fVar136 * auVar65._12_4_;
            auVar56 = vfmadd231ps_fma(auVar168,auVar194,auVar56);
            auVar201._0_4_ = fVar136 * auVar56._0_4_;
            auVar201._4_4_ = fVar136 * auVar56._4_4_;
            auVar201._8_4_ = fVar136 * auVar56._8_4_;
            auVar201._12_4_ = fVar136 * auVar56._12_4_;
            auVar65 = vfmadd231ps_fma(auVar201,auVar62,auVar194);
            auVar62 = vsubps_avx(auVar56,auVar62);
            auVar16._8_4_ = 0x40400000;
            auVar16._0_8_ = 0x4040000040400000;
            auVar16._12_4_ = 0x40400000;
            auVar56 = vmulps_avx512vl(auVar62,auVar16);
            _local_4c0 = auVar65;
            auVar62 = vsubps_avx(auVar61,auVar65);
            _local_820 = auVar62;
            auVar62 = vdpps_avx(auVar62,auVar62,0x7f);
            local_880._0_16_ = auVar62;
            local_840._4_4_ = uVar138;
            local_840._0_4_ = fVar136;
            local_840._8_4_ = uVar230;
            local_840._16_16_ = auVar69._16_16_;
            local_840._12_4_ = uVar231;
            local_6e0._0_16_ = auVar208._0_16_;
            if (auVar62._0_4_ < 0.0) {
              auVar224._0_4_ = sqrtf(auVar62._0_4_);
              auVar224._4_60_ = extraout_var;
              auVar62 = auVar224._0_16_;
              uVar54 = extraout_RAX;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
            }
            local_660._0_16_ = vdpps_avx(auVar56,auVar56,0x7f);
            fVar136 = local_660._0_4_;
            auVar169._4_12_ = ZEXT812(0) << 0x20;
            auVar169._0_4_ = fVar136;
            local_680._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
            fVar156 = local_680._0_4_;
            local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar65 = vxorps_avx512vl(local_660._0_16_,auVar17);
            auVar61 = vfnmadd213ss_fma(local_500._0_16_,local_660._0_16_,ZEXT416(0x40000000));
            local_520._0_4_ = auVar61._0_4_;
            local_640._0_4_ = auVar62._0_4_;
            if (fVar136 < auVar65._0_4_) {
              auVar229._0_4_ = sqrtf(fVar136);
              auVar229._4_60_ = extraout_var_00;
              auVar62 = ZEXT416((uint)local_640._0_4_);
              auVar61 = auVar229._0_16_;
              uVar54 = extraout_RAX_00;
            }
            else {
              auVar61 = vsqrtss_avx512f(local_660._0_16_,local_660._0_16_);
            }
            fVar158 = local_680._0_4_;
            fVar136 = fVar156 * 1.5 + fVar136 * -0.5 * fVar158 * fVar158 * fVar158;
            local_680._0_4_ = auVar56._0_4_ * fVar136;
            local_680._4_4_ = auVar56._4_4_ * fVar136;
            local_680._8_4_ = auVar56._8_4_ * fVar136;
            local_680._12_4_ = auVar56._12_4_ * fVar136;
            auVar65 = vdpps_avx(_local_820,local_680._0_16_,0x7f);
            fVar120 = auVar62._0_4_;
            fVar156 = auVar65._0_4_;
            auVar125._0_4_ = fVar156 * fVar156;
            auVar125._4_4_ = auVar65._4_4_ * auVar65._4_4_;
            auVar125._8_4_ = auVar65._8_4_ * auVar65._8_4_;
            auVar125._12_4_ = auVar65._12_4_ * auVar65._12_4_;
            auVar63 = vsubps_avx(local_880._0_16_,auVar125);
            fVar158 = auVar63._0_4_;
            auVar142._4_12_ = ZEXT812(0) << 0x20;
            auVar142._0_4_ = fVar158;
            auVar57 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar142);
            auVar66 = vmulss_avx512f(auVar57,ZEXT416(0x3fc00000));
            auVar64 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
            if (fVar158 < 0.0) {
              local_5e0._0_4_ = auVar66._0_4_;
              local_600 = fVar136;
              fStack_5fc = fVar136;
              fStack_5f8 = fVar136;
              fStack_5f4 = fVar136;
              local_5f0 = auVar57;
              fVar158 = sqrtf(fVar158);
              auVar64 = ZEXT416(auVar64._0_4_);
              auVar66 = ZEXT416((uint)local_5e0._0_4_);
              auVar61 = ZEXT416(auVar61._0_4_);
              auVar62 = ZEXT416((uint)local_640._0_4_);
              uVar54 = extraout_RAX_01;
              auVar57 = local_5f0;
              fVar136 = local_600;
              fVar160 = fStack_5fc;
              fVar162 = fStack_5f8;
              fVar164 = fStack_5f4;
            }
            else {
              auVar63 = vsqrtss_avx(auVar63,auVar63);
              fVar158 = auVar63._0_4_;
              fVar160 = fVar136;
              fVar162 = fVar136;
              fVar164 = fVar136;
            }
            auVar246 = ZEXT3264(local_860);
            auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,
                                      local_4e0._0_16_);
            fVar137 = auVar63._0_4_ * 6.0;
            fVar155 = local_840._0_4_ * 6.0;
            auVar170._0_4_ = fVar155 * (float)local_5c0._0_4_;
            auVar170._4_4_ = fVar155 * (float)local_5c0._4_4_;
            auVar170._8_4_ = fVar155 * fStack_5b8;
            auVar170._12_4_ = fVar155 * fStack_5b4;
            auVar143._4_4_ = fVar137;
            auVar143._0_4_ = fVar137;
            auVar143._8_4_ = fVar137;
            auVar143._12_4_ = fVar137;
            auVar63 = vfmadd132ps_fma(auVar143,auVar170,local_580._0_16_);
            auVar58 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                      local_840._0_16_);
            fVar137 = auVar58._0_4_ * 6.0;
            auVar171._4_4_ = fVar137;
            auVar171._0_4_ = fVar137;
            auVar171._8_4_ = fVar137;
            auVar171._12_4_ = fVar137;
            auVar63 = vfmadd132ps_fma(auVar171,auVar63,local_5a0._0_16_);
            fVar137 = local_4e0._0_4_ * 6.0;
            auVar144._4_4_ = fVar137;
            auVar144._0_4_ = fVar137;
            auVar144._8_4_ = fVar137;
            auVar144._12_4_ = fVar137;
            auVar63 = vfmadd132ps_fma(auVar144,auVar63,local_560._0_16_);
            auVar172._0_4_ = auVar63._0_4_ * (float)local_660._0_4_;
            auVar172._4_4_ = auVar63._4_4_ * (float)local_660._0_4_;
            auVar172._8_4_ = auVar63._8_4_ * (float)local_660._0_4_;
            auVar172._12_4_ = auVar63._12_4_ * (float)local_660._0_4_;
            auVar63 = vdpps_avx(auVar56,auVar63,0x7f);
            fVar137 = auVar63._0_4_;
            auVar145._0_4_ = auVar56._0_4_ * fVar137;
            auVar145._4_4_ = auVar56._4_4_ * fVar137;
            auVar145._8_4_ = auVar56._8_4_ * fVar137;
            auVar145._12_4_ = auVar56._12_4_ * fVar137;
            auVar63 = vsubps_avx(auVar172,auVar145);
            fVar137 = (float)local_520._0_4_ * (float)local_500._0_4_;
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar67 = vxorps_avx512vl(auVar56,auVar18);
            auVar202._0_4_ = fVar136 * auVar63._0_4_ * fVar137;
            auVar202._4_4_ = fVar160 * auVar63._4_4_ * fVar137;
            auVar202._8_4_ = fVar162 * auVar63._8_4_ * fVar137;
            auVar202._12_4_ = fVar164 * auVar63._12_4_ * fVar137;
            auVar243 = ZEXT1664(local_680._0_16_);
            auVar63 = vdpps_avx(auVar67,local_680._0_16_,0x7f);
            auVar58 = vmaxss_avx(ZEXT416((uint)local_540._0_4_),
                                 ZEXT416((uint)((float)local_6e0._0_4_ * fVar154 * 1.9073486e-06)));
            auVar68 = vdivss_avx512f(ZEXT416((uint)local_540._0_4_),auVar61);
            auVar61 = vdpps_avx(_local_820,auVar202,0x7f);
            auVar62 = vfmadd213ss_fma(auVar62,ZEXT416((uint)local_540._0_4_),auVar58);
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)(fVar120 + 1.0)),auVar68,auVar62);
            auVar62 = vdpps_avx(local_6b0,local_680._0_16_,0x7f);
            fVar120 = auVar63._0_4_ + auVar61._0_4_;
            auVar61 = vdpps_avx(_local_820,auVar67,0x7f);
            auVar64 = vmulss_avx512f(auVar64,auVar57);
            auVar57 = vmulss_avx512f(auVar57,auVar57);
            auVar63 = vdpps_avx(_local_820,local_6b0,0x7f);
            auVar64 = vaddss_avx512f(auVar66,ZEXT416((uint)(auVar64._0_4_ * auVar57._0_4_)));
            auVar57 = vfnmadd231ss_fma(auVar61,auVar65,ZEXT416((uint)fVar120));
            auVar66 = vfnmadd231ss_fma(auVar63,auVar65,auVar62);
            auVar61 = vpermilps_avx(_local_4c0,0xff);
            fVar158 = fVar158 - auVar61._0_4_;
            auVar61 = vshufps_avx(auVar56,auVar56,0xff);
            auVar63 = vfmsub213ss_fma(auVar57,auVar64,auVar61);
            fVar136 = auVar66._0_4_ * auVar64._0_4_;
            auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar62._0_4_ * auVar63._0_4_)),
                                      ZEXT416((uint)fVar120),ZEXT416((uint)fVar136));
            fVar160 = auVar57._0_4_;
            fVar136 = local_840._0_4_ -
                      (fVar156 * (fVar136 / fVar160) - fVar158 * (auVar62._0_4_ / fVar160));
            uVar138 = 0;
            uVar230 = 0;
            uVar231 = 0;
            fVar156 = (float)local_6e0._0_4_ -
                      (fVar158 * (fVar120 / fVar160) - fVar156 * (auVar63._0_4_ / fVar160));
            auVar208 = ZEXT464((uint)fVar156);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar62 = vandps_avx512vl(auVar65,auVar19);
            if (auVar62._0_4_ < auVar68._0_4_) {
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar68._0_4_ + auVar58._0_4_)),local_610,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(ZEXT416((uint)fVar158),auVar20);
              if (auVar65._0_4_ < auVar62._0_4_) {
                bVar51 = uVar50 < 5;
                fVar156 = fVar156 + (float)local_620._0_4_;
                if ((fVar119 <= fVar156) &&
                   (fVar154 = *(float *)(ray + k * 4 + 0x80), fVar156 <= fVar154)) {
                  bVar44 = 0;
                  if ((fVar136 < 0.0) || (1.0 < fVar136)) goto LAB_01827044;
                  auVar173._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar173._0_4_ = local_880._0_4_;
                  auVar62 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar173);
                  fVar158 = auVar62._0_4_;
                  auVar49 = (undefined1  [8])(context->scene->geometries).items[local_898].ptr;
                  if ((((Geometry *)auVar49)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar44 = 1,
                       ((Geometry *)auVar49)->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01827044;
                    fVar158 = fVar158 * 1.5 + local_880._0_4_ * -0.5 * fVar158 * fVar158 * fVar158;
                    auVar174._0_4_ = local_820._0_4_ * fVar158;
                    auVar174._4_4_ = local_820._4_4_ * fVar158;
                    auVar174._8_4_ = local_820._8_4_ * fVar158;
                    auVar174._12_4_ = local_820._12_4_ * fVar158;
                    auVar65 = vfmadd213ps_fma(auVar61,auVar174,auVar56);
                    auVar62 = vshufps_avx(auVar174,auVar174,0xc9);
                    auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
                    auVar175._0_4_ = auVar174._0_4_ * auVar61._0_4_;
                    auVar175._4_4_ = auVar174._4_4_ * auVar61._4_4_;
                    auVar175._8_4_ = auVar174._8_4_ * auVar61._8_4_;
                    auVar175._12_4_ = auVar174._12_4_ * auVar61._12_4_;
                    auVar56 = vfmsub231ps_fma(auVar175,auVar56,auVar62);
                    auVar62 = vshufps_avx(auVar56,auVar56,0xc9);
                    auVar61 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar56 = vshufps_avx(auVar56,auVar56,0xd2);
                    auVar126._0_4_ = auVar65._0_4_ * auVar56._0_4_;
                    auVar126._4_4_ = auVar65._4_4_ * auVar56._4_4_;
                    auVar126._8_4_ = auVar65._8_4_ * auVar56._8_4_;
                    auVar126._12_4_ = auVar65._12_4_ * auVar56._12_4_;
                    auVar62 = vfmsub231ps_fma(auVar126,auVar62,auVar61);
                    local_460 = (RTCHitN  [16])vshufps_avx(auVar62,auVar62,0x55);
                    auStack_450 = vshufps_avx(auVar62,auVar62,0xaa);
                    local_440 = auVar62._0_4_;
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    local_430 = fVar136;
                    fStack_42c = fVar136;
                    fStack_428 = fVar136;
                    fStack_424 = fVar136;
                    local_420 = ZEXT416(0) << 0x20;
                    local_410 = local_470._0_8_;
                    uStack_408 = local_470._8_8_;
                    local_400 = local_480;
                    vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                    uStack_3ec = context->user->instID[0];
                    local_3f0 = uStack_3ec;
                    uStack_3e8 = uStack_3ec;
                    uStack_3e4 = uStack_3ec;
                    uStack_3e0 = context->user->instPrimID[0];
                    uStack_3dc = uStack_3e0;
                    uStack_3d8 = uStack_3e0;
                    uStack_3d4 = uStack_3e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar156;
                    local_8b0 = local_490;
                    local_7f0.valid = (int *)local_8b0;
                    local_7f0.geometryUserPtr = ((Geometry *)auVar49)->userPtr;
                    local_7f0.context = context->user;
                    local_7f0.hit = local_460;
                    local_7f0.N = 4;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (((Geometry *)auVar49)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_820 = auVar49;
                      auVar243 = ZEXT1664(local_680._0_16_);
                      (*((Geometry *)auVar49)->occlusionFilterN)(&local_7f0);
                      auVar246 = ZEXT3264(local_860);
                      auVar49 = local_820;
                    }
                    uVar54 = vptestmd_avx512vl(local_8b0,local_8b0);
                    if ((uVar54 & 0xf) != 0) {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((((Geometry *)auVar49)->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        (*p_Var2)(&local_7f0);
                        auVar246 = ZEXT3264(local_860);
                      }
                      uVar54 = vptestmd_avx512vl(local_8b0,local_8b0);
                      uVar54 = uVar54 & 0xf;
                      auVar62 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar3 = (bool)((byte)uVar54 & 1);
                      bVar4 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar6 = SUB81(uVar54 >> 3,0);
                      *(uint *)(local_7f0.ray + 0x80) =
                           (uint)bVar3 * auVar62._0_4_ |
                           (uint)!bVar3 * *(int *)(local_7f0.ray + 0x80);
                      *(uint *)(local_7f0.ray + 0x84) =
                           (uint)bVar4 * auVar62._4_4_ |
                           (uint)!bVar4 * *(int *)(local_7f0.ray + 0x84);
                      *(uint *)(local_7f0.ray + 0x88) =
                           (uint)bVar5 * auVar62._8_4_ |
                           (uint)!bVar5 * *(int *)(local_7f0.ray + 0x88);
                      *(uint *)(local_7f0.ray + 0x8c) =
                           (uint)bVar6 * auVar62._12_4_ |
                           (uint)!bVar6 * *(int *)(local_7f0.ray + 0x8c);
                      bVar44 = 1;
                      if ((byte)uVar54 != 0) goto LAB_01827044;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar154;
                  }
                }
                bVar44 = 0;
                goto LAB_01827044;
              }
            }
            uVar50 = uVar50 + 1;
          }
          bVar51 = false;
LAB_01827044:
          bVar45 = bVar45 | bVar51 & bVar44;
          uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar215._4_4_ = uVar138;
          auVar215._0_4_ = uVar138;
          auVar215._8_4_ = uVar138;
          auVar215._12_4_ = uVar138;
          auVar215._16_4_ = uVar138;
          auVar215._20_4_ = uVar138;
          auVar215._24_4_ = uVar138;
          auVar215._28_4_ = uVar138;
          auVar208 = ZEXT3264(auVar215);
          auVar40._4_4_ = fStack_31c;
          auVar40._0_4_ = local_320;
          auVar40._8_4_ = fStack_318;
          auVar40._12_4_ = fStack_314;
          auVar40._16_4_ = fStack_310;
          auVar40._20_4_ = fStack_30c;
          auVar40._24_4_ = fStack_308;
          auVar40._28_4_ = fStack_304;
          uVar10 = vcmpps_avx512vl(auVar215,auVar40,0xd);
        }
        auVar133._0_4_ = (float)local_6a0._0_4_ + (float)local_340._0_4_;
        auVar133._4_4_ = (float)local_6a0._4_4_ + (float)local_340._4_4_;
        auVar133._8_4_ = fStack_698 + fStack_338;
        auVar133._12_4_ = fStack_694 + fStack_334;
        auVar133._16_4_ = fStack_690 + fStack_330;
        auVar133._20_4_ = fStack_68c + fStack_32c;
        auVar133._24_4_ = fStack_688 + fStack_328;
        auVar133._28_4_ = fStack_684 + fStack_324;
        uVar138 = auVar208._0_4_;
        auVar152._4_4_ = uVar138;
        auVar152._0_4_ = uVar138;
        auVar152._8_4_ = uVar138;
        auVar152._12_4_ = uVar138;
        auVar152._16_4_ = uVar138;
        auVar152._20_4_ = uVar138;
        auVar152._24_4_ = uVar138;
        auVar152._28_4_ = uVar138;
        uVar10 = vcmpps_avx512vl(auVar133,auVar152,2);
        auVar134._8_4_ = 2;
        auVar134._0_8_ = 0x200000002;
        auVar134._12_4_ = 2;
        auVar134._16_4_ = 2;
        auVar134._20_4_ = 2;
        auVar134._24_4_ = 2;
        auVar134._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar69 = vpblendmd_avx512vl(auVar134,auVar28);
        bVar51 = (bool)((byte)local_890 & 1);
        local_340._0_4_ = (uint)bVar51 * auVar69._0_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)((byte)(local_890 >> 1) & 1);
        local_340._4_4_ = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * 2;
        bVar51 = (bool)((byte)(local_890 >> 2) & 1);
        fStack_338 = (float)((uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * 2);
        bVar51 = (bool)((byte)(local_890 >> 3) & 1);
        fStack_334 = (float)((uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * 2);
        bVar51 = (bool)((byte)(local_890 >> 4) & 1);
        fStack_330 = (float)((uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * 2);
        bVar51 = (bool)((byte)(local_890 >> 5) & 1);
        fStack_32c = (float)((uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * 2);
        bVar51 = (bool)((byte)(local_890 >> 6) & 1);
        fStack_328 = (float)((uint)bVar51 * auVar69._24_4_ | (uint)!bVar51 * 2);
        bVar51 = (bool)((byte)(local_890 >> 7) & 1);
        fStack_324 = (float)((uint)bVar51 * auVar69._28_4_ | (uint)!bVar51 * 2);
        bVar43 = (byte)uVar11 & bVar43 & (byte)uVar10;
        uVar10 = vpcmpd_avx512vl(_local_340,local_2e0,2);
        local_360 = _local_2c0;
        local_320 = (float)local_6a0._0_4_ + (float)local_2c0._0_4_;
        fStack_31c = (float)local_6a0._4_4_ + (float)local_2c0._4_4_;
        fStack_318 = fStack_698 + fStack_2b8;
        fStack_314 = fStack_694 + fStack_2b4;
        fStack_310 = fStack_690 + fStack_2b0;
        fStack_30c = fStack_68c + fStack_2ac;
        fStack_308 = fStack_688 + fStack_2a8;
        fStack_304 = fStack_684 + fStack_2a4;
        auVar244 = ZEXT3264(local_700);
        auVar245 = ZEXT3264(local_720);
        auVar239 = ZEXT3264(local_740);
        auVar229 = ZEXT3264(local_760);
        auVar224 = ZEXT3264(local_780);
        auVar235 = ZEXT3264(local_7a0);
        auVar227 = ZEXT3264(local_7c0);
        for (bVar48 = (byte)uVar10 & bVar43; bVar48 != 0; bVar48 = ~bVar46 & bVar48 & (byte)uVar10)
        {
          auVar135._8_4_ = 0x7f800000;
          auVar135._0_8_ = 0x7f8000007f800000;
          auVar135._12_4_ = 0x7f800000;
          auVar135._16_4_ = 0x7f800000;
          auVar135._20_4_ = 0x7f800000;
          auVar135._24_4_ = 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar69 = vblendmps_avx512vl(auVar135,local_360);
          auVar111._0_4_ =
               (uint)(bVar48 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar48 & 1) * 0x7f800000;
          bVar51 = (bool)(bVar48 >> 1 & 1);
          auVar111._4_4_ = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar48 >> 2 & 1);
          auVar111._8_4_ = (uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar48 >> 3 & 1);
          auVar111._12_4_ = (uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar48 >> 4 & 1);
          auVar111._16_4_ = (uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * 0x7f800000;
          bVar51 = (bool)(bVar48 >> 5 & 1);
          auVar111._20_4_ = (uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * 0x7f800000;
          auVar111._24_4_ =
               (uint)(bVar48 >> 6) * auVar69._24_4_ | (uint)!(bool)(bVar48 >> 6) * 0x7f800000;
          auVar111._28_4_ = 0x7f800000;
          auVar69 = vshufps_avx(auVar111,auVar111,0xb1);
          auVar69 = vminps_avx(auVar111,auVar69);
          auVar79 = vshufpd_avx(auVar69,auVar69,5);
          auVar69 = vminps_avx(auVar69,auVar79);
          auVar79 = vpermpd_avx2(auVar69,0x4e);
          auVar69 = vminps_avx(auVar69,auVar79);
          uVar10 = vcmpps_avx512vl(auVar111,auVar69,0);
          bVar44 = (byte)uVar10 & bVar48;
          bVar46 = bVar48;
          if (bVar44 != 0) {
            bVar46 = bVar44;
          }
          iVar13 = 0;
          for (uVar55 = (uint)bVar46; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
            iVar13 = iVar13 + 1;
          }
          bVar46 = '\x01' << ((byte)iVar13 & 0x1f);
          fVar156 = local_884;
          fVar154 = *(float *)(local_200 + (uint)(iVar13 << 2));
          uVar138 = 0;
          uVar230 = 0;
          uVar231 = 0;
          fVar136 = *(float *)(local_2a0 + (uint)(iVar13 << 2));
          uVar232 = 0;
          uVar240 = 0;
          uVar241 = 0;
          if ((float)local_6c0._0_4_ < 0.0) {
            local_880._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar13 << 2)));
            local_840._0_16_ = ZEXT416((uint)*(float *)(local_2a0 + (uint)(iVar13 << 2)));
            auVar243 = ZEXT1664(auVar243._0_16_);
            fVar156 = sqrtf((float)local_6c0._0_4_);
            auVar246 = ZEXT3264(local_860);
            auVar227 = ZEXT3264(local_7c0);
            auVar235 = ZEXT3264(local_7a0);
            auVar224 = ZEXT3264(local_780);
            auVar229 = ZEXT3264(local_760);
            auVar239 = ZEXT3264(local_740);
            auVar245 = ZEXT3264(local_720);
            auVar244 = ZEXT3264(local_700);
            fVar154 = (float)local_880._0_4_;
            uVar138 = local_880._4_4_;
            uVar230 = local_880._8_4_;
            uVar231 = local_880._12_4_;
            fVar136 = (float)local_840._0_4_;
            uVar232 = local_840._4_4_;
            uVar240 = local_840._8_4_;
            uVar241 = local_840._12_4_;
          }
          uVar54 = (ulong)bVar46;
          auVar61 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar62 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar56 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar65 = vminps_avx(auVar61,auVar56);
          auVar61 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar56 = vmaxps_avx(auVar62,auVar61);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx(auVar65,auVar195);
          auVar61 = vandps_avx(auVar56,auVar195);
          auVar62 = vmaxps_avx(auVar62,auVar61);
          auVar61 = vmovshdup_avx(auVar62);
          auVar61 = vmaxss_avx(auVar61,auVar62);
          auVar62 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vmaxss_avx(auVar62,auVar61);
          local_540._0_4_ = auVar62._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar56,auVar56,0xff);
          uVar50 = 0;
          while( true ) {
            auVar79 = local_840;
            auVar69 = local_880;
            bVar44 = (byte)uVar54;
            if (uVar50 == 5) break;
            auVar127._4_4_ = fVar136;
            auVar127._0_4_ = fVar136;
            auVar127._8_4_ = fVar136;
            auVar127._12_4_ = fVar136;
            auVar61 = vfmadd132ps_fma(auVar127,ZEXT816(0) << 0x40,local_6b0);
            fVar158 = 1.0 - fVar154;
            auVar176._0_4_ = local_5a0._0_4_ * fVar154;
            auVar176._4_4_ = local_5a0._4_4_ * fVar154;
            auVar176._8_4_ = local_5a0._8_4_ * fVar154;
            auVar176._12_4_ = local_5a0._12_4_ * fVar154;
            local_4e0._0_16_ = ZEXT416((uint)fVar158);
            auVar196._4_4_ = fVar158;
            auVar196._0_4_ = fVar158;
            auVar196._8_4_ = fVar158;
            auVar196._12_4_ = fVar158;
            auVar62 = vfmadd231ps_fma(auVar176,auVar196,local_560._0_16_);
            auVar203._0_4_ = local_580._0_4_ * fVar154;
            auVar203._4_4_ = local_580._4_4_ * fVar154;
            auVar203._8_4_ = local_580._8_4_ * fVar154;
            auVar203._12_4_ = local_580._12_4_ * fVar154;
            auVar56 = vfmadd231ps_fma(auVar203,auVar196,local_5a0._0_16_);
            auVar214._0_4_ = fVar154 * (float)local_5c0._0_4_;
            auVar214._4_4_ = fVar154 * (float)local_5c0._4_4_;
            auVar214._8_4_ = fVar154 * fStack_5b8;
            auVar214._12_4_ = fVar154 * fStack_5b4;
            auVar65 = vfmadd231ps_fma(auVar214,auVar196,local_580._0_16_);
            auVar222._0_4_ = fVar154 * auVar56._0_4_;
            auVar222._4_4_ = fVar154 * auVar56._4_4_;
            auVar222._8_4_ = fVar154 * auVar56._8_4_;
            auVar222._12_4_ = fVar154 * auVar56._12_4_;
            auVar62 = vfmadd231ps_fma(auVar222,auVar196,auVar62);
            auVar177._0_4_ = fVar154 * auVar65._0_4_;
            auVar177._4_4_ = fVar154 * auVar65._4_4_;
            auVar177._8_4_ = fVar154 * auVar65._8_4_;
            auVar177._12_4_ = fVar154 * auVar65._12_4_;
            auVar56 = vfmadd231ps_fma(auVar177,auVar196,auVar56);
            auVar204._0_4_ = fVar154 * auVar56._0_4_;
            auVar204._4_4_ = fVar154 * auVar56._4_4_;
            auVar204._8_4_ = fVar154 * auVar56._8_4_;
            auVar204._12_4_ = fVar154 * auVar56._12_4_;
            auVar65 = vfmadd231ps_fma(auVar204,auVar62,auVar196);
            auVar62 = vsubps_avx(auVar56,auVar62);
            auVar21._8_4_ = 0x40400000;
            auVar21._0_8_ = 0x4040000040400000;
            auVar21._12_4_ = 0x40400000;
            auVar56 = vmulps_avx512vl(auVar62,auVar21);
            _local_4c0 = auVar65;
            auVar62 = vsubps_avx(auVar61,auVar65);
            _local_820 = auVar62;
            auVar62 = vdpps_avx(auVar62,auVar62,0x7f);
            local_6e0._0_16_ = auVar62;
            local_880._4_4_ = uVar138;
            local_880._0_4_ = fVar154;
            local_880._8_4_ = uVar230;
            local_880._16_16_ = auVar69._16_16_;
            local_880._12_4_ = uVar231;
            local_840._4_4_ = uVar232;
            local_840._0_4_ = fVar136;
            local_840._8_4_ = uVar240;
            local_840._16_16_ = auVar79._16_16_;
            local_840._12_4_ = uVar241;
            if (auVar62._0_4_ < 0.0) {
              auVar235._0_4_ = sqrtf(auVar62._0_4_);
              auVar235._4_60_ = extraout_var_01;
              auVar62 = auVar235._0_16_;
              uVar54 = extraout_RAX_02;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
            }
            local_500._0_16_ = vdpps_avx(auVar56,auVar56,0x7f);
            fVar136 = local_500._0_4_;
            auVar178._4_12_ = ZEXT812(0) << 0x20;
            auVar178._0_4_ = fVar136;
            local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            fVar154 = local_660._0_4_;
            local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar65 = vxorps_avx512vl(local_500._0_16_,auVar22);
            auVar61 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
            local_680._0_4_ = auVar61._0_4_;
            local_640._0_4_ = auVar62._0_4_;
            if (fVar136 < auVar65._0_4_) {
              fVar158 = sqrtf(fVar136);
              auVar62 = ZEXT416((uint)local_640._0_4_);
              uVar54 = extraout_RAX_03;
            }
            else {
              auVar61 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
              fVar158 = auVar61._0_4_;
            }
            fVar120 = local_660._0_4_;
            fVar136 = fVar154 * 1.5 + fVar136 * -0.5 * fVar120 * fVar120 * fVar120;
            local_9e0 = auVar56._0_4_;
            fStack_9dc = auVar56._4_4_;
            fStack_9d8 = auVar56._8_4_;
            fStack_9d4 = auVar56._12_4_;
            auVar242._0_4_ = fVar136 * local_9e0;
            auVar242._4_4_ = fVar136 * fStack_9dc;
            auVar242._8_4_ = fVar136 * fStack_9d8;
            auVar242._12_4_ = fVar136 * fStack_9d4;
            local_660._0_16_ = vdpps_avx(auVar242,_local_820,0x7f);
            auVar63 = vaddss_avx512f(auVar62,ZEXT416(0x3f800000));
            auVar128._0_4_ = local_660._0_4_ * local_660._0_4_;
            auVar128._4_4_ = local_660._4_4_ * local_660._4_4_;
            auVar128._8_4_ = local_660._8_4_ * local_660._8_4_;
            auVar128._12_4_ = local_660._12_4_ * local_660._12_4_;
            auVar61 = vsubps_avx(local_6e0._0_16_,auVar128);
            fVar154 = auVar61._0_4_;
            auVar146._4_12_ = ZEXT812(0) << 0x20;
            auVar146._0_4_ = fVar154;
            auVar65 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
            auVar57 = vmulss_avx512f(auVar65,ZEXT416(0x3fc00000));
            auVar66 = vmulss_avx512f(auVar61,ZEXT416(0xbf000000));
            uVar53 = fVar154 == 0.0;
            uVar52 = fVar154 < 0.0;
            if ((bool)uVar52) {
              local_600 = fVar136;
              fStack_5fc = fVar136;
              fStack_5f8 = fVar136;
              fStack_5f4 = fVar136;
              local_5f0 = auVar242;
              local_5e0 = auVar65;
              fVar120 = sqrtf(fVar154);
              auVar66 = ZEXT416(auVar66._0_4_);
              auVar57 = ZEXT416(auVar57._0_4_);
              auVar62 = ZEXT416((uint)local_640._0_4_);
              auVar63 = ZEXT416(auVar63._0_4_);
              uVar54 = extraout_RAX_04;
              auVar242 = local_5f0;
              auVar65 = local_5e0;
              fVar136 = local_600;
              fVar154 = fStack_5fc;
              fVar160 = fStack_5f8;
              fVar162 = fStack_5f4;
            }
            else {
              auVar61 = vsqrtss_avx(auVar61,auVar61);
              fVar120 = auVar61._0_4_;
              fVar154 = fVar136;
              fVar160 = fVar136;
              fVar162 = fVar136;
            }
            auVar243 = ZEXT1664(auVar242);
            auVar244 = ZEXT3264(local_700);
            auVar245 = ZEXT3264(local_720);
            auVar239 = ZEXT3264(local_740);
            auVar229 = ZEXT3264(local_760);
            auVar235 = ZEXT3264(local_7a0);
            auVar246 = ZEXT3264(local_860);
            auVar61 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,
                                      local_4e0._0_16_);
            fVar164 = auVar61._0_4_ * 6.0;
            fVar137 = local_880._0_4_ * 6.0;
            auVar179._0_4_ = fVar137 * (float)local_5c0._0_4_;
            auVar179._4_4_ = fVar137 * (float)local_5c0._4_4_;
            auVar179._8_4_ = fVar137 * fStack_5b8;
            auVar179._12_4_ = fVar137 * fStack_5b4;
            auVar147._4_4_ = fVar164;
            auVar147._0_4_ = fVar164;
            auVar147._8_4_ = fVar164;
            auVar147._12_4_ = fVar164;
            auVar61 = vfmadd132ps_fma(auVar147,auVar179,local_580._0_16_);
            auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                      local_880._0_16_);
            fVar164 = auVar64._0_4_ * 6.0;
            auVar180._4_4_ = fVar164;
            auVar180._0_4_ = fVar164;
            auVar180._8_4_ = fVar164;
            auVar180._12_4_ = fVar164;
            auVar61 = vfmadd132ps_fma(auVar180,auVar61,local_5a0._0_16_);
            fVar164 = local_4e0._0_4_ * 6.0;
            auVar148._4_4_ = fVar164;
            auVar148._0_4_ = fVar164;
            auVar148._8_4_ = fVar164;
            auVar148._12_4_ = fVar164;
            auVar61 = vfmadd132ps_fma(auVar148,auVar61,local_560._0_16_);
            auVar181._0_4_ = auVar61._0_4_ * (float)local_500._0_4_;
            auVar181._4_4_ = auVar61._4_4_ * (float)local_500._0_4_;
            auVar181._8_4_ = auVar61._8_4_ * (float)local_500._0_4_;
            auVar181._12_4_ = auVar61._12_4_ * (float)local_500._0_4_;
            auVar61 = vdpps_avx(auVar56,auVar61,0x7f);
            fVar164 = auVar61._0_4_;
            auVar149._0_4_ = local_9e0 * fVar164;
            auVar149._4_4_ = fStack_9dc * fVar164;
            auVar149._8_4_ = fStack_9d8 * fVar164;
            auVar149._12_4_ = fStack_9d4 * fVar164;
            auVar61 = vsubps_avx(auVar181,auVar149);
            fVar164 = (float)local_680._0_4_ * (float)local_520._0_4_;
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar68 = vxorps_avx512vl(auVar56,auVar23);
            auVar205._0_4_ = fVar136 * auVar61._0_4_ * fVar164;
            auVar205._4_4_ = fVar154 * auVar61._4_4_ * fVar164;
            auVar205._8_4_ = fVar160 * auVar61._8_4_ * fVar164;
            auVar205._12_4_ = fVar162 * auVar61._12_4_ * fVar164;
            auVar61 = vdpps_avx(auVar68,auVar242,0x7f);
            auVar58 = vmaxss_avx(ZEXT416((uint)local_540._0_4_),
                                 ZEXT416((uint)((float)local_840._0_4_ * fVar156 * 1.9073486e-06)));
            auVar64 = vdpps_avx(_local_820,auVar205,0x7f);
            auVar62 = vfmadd213ss_fma(auVar62,ZEXT416((uint)local_540._0_4_),auVar58);
            vfmadd213ss_avx512f(auVar63,ZEXT416((uint)((float)local_540._0_4_ / fVar158)),auVar62);
            auVar62 = vdpps_avx(local_6b0,auVar242,0x7f);
            fVar136 = auVar61._0_4_ + auVar64._0_4_;
            auVar61 = vdpps_avx(_local_820,auVar68,0x7f);
            auVar63 = vmulss_avx512f(auVar66,auVar65);
            auVar66 = vmulss_avx512f(auVar65,auVar65);
            auVar65 = vdpps_avx(_local_820,local_6b0,0x7f);
            auVar66 = vaddss_avx512f(auVar57,ZEXT416((uint)(auVar63._0_4_ * auVar66._0_4_)));
            auVar63 = vfnmadd231ss_fma(auVar61,local_660._0_16_,ZEXT416((uint)fVar136));
            auVar57 = vfnmadd231ss_fma(auVar65,local_660._0_16_,auVar62);
            auVar61 = vpermilps_avx(_local_4c0,0xff);
            fVar120 = fVar120 - auVar61._0_4_;
            auVar61 = vshufps_avx(auVar56,auVar56,0xff);
            auVar65 = vfmsub213ss_fma(auVar63,auVar66,auVar61);
            fVar154 = auVar57._0_4_ * auVar66._0_4_;
            auVar63 = vfmsub231ss_fma(ZEXT416((uint)(auVar62._0_4_ * auVar65._0_4_)),
                                      ZEXT416((uint)fVar136),ZEXT416((uint)fVar154));
            fVar158 = auVar63._0_4_;
            fVar154 = local_880._0_4_ -
                      (local_660._0_4_ * (fVar154 / fVar158) - fVar120 * (auVar62._0_4_ / fVar158));
            uVar138 = 0;
            uVar230 = 0;
            uVar231 = 0;
            fVar136 = (float)local_840._0_4_ -
                      (fVar120 * (fVar136 / fVar158) - local_660._0_4_ * (auVar65._0_4_ / fVar158));
            uVar232 = 0;
            uVar240 = 0;
            uVar241 = 0;
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar62 = vandps_avx512vl(local_660._0_16_,auVar24);
            auVar62 = vucomiss_avx512f(auVar62);
            if (!(bool)uVar52 && !(bool)uVar53) {
              auVar62 = vaddss_avx512f(auVar58,auVar62);
              auVar62 = vfmadd231ss_fma(auVar62,local_610,ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(ZEXT416((uint)fVar120),auVar25);
              if (auVar65._0_4_ < auVar62._0_4_) {
                bVar51 = uVar50 < 5;
                fVar136 = fVar136 + (float)local_620._0_4_;
                auVar224 = ZEXT3264(local_780);
                auVar227 = ZEXT3264(local_7c0);
                if ((fVar119 <= fVar136) &&
                   (fVar156 = *(float *)(ray + k * 4 + 0x80), fVar136 <= fVar156)) {
                  bVar44 = 0;
                  if ((fVar154 < 0.0) || (1.0 < fVar154)) goto LAB_01827bbc;
                  auVar182._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar182._0_4_ = local_6e0._0_4_;
                  auVar62 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar182);
                  fVar158 = auVar62._0_4_;
                  pGVar1 = (context->scene->geometries).items[local_898].ptr;
                  if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar44 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01827bbc;
                    fVar158 = fVar158 * 1.5 +
                              (float)local_6e0._0_4_ * -0.5 * fVar158 * fVar158 * fVar158;
                    auVar183._0_4_ = fVar158 * (float)local_820._0_4_;
                    auVar183._4_4_ = fVar158 * (float)local_820._4_4_;
                    auVar183._8_4_ = fVar158 * fStack_818;
                    auVar183._12_4_ = fVar158 * fStack_814;
                    auVar65 = vfmadd213ps_fma(auVar61,auVar183,auVar56);
                    auVar62 = vshufps_avx(auVar183,auVar183,0xc9);
                    auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
                    auVar184._0_4_ = auVar183._0_4_ * auVar61._0_4_;
                    auVar184._4_4_ = auVar183._4_4_ * auVar61._4_4_;
                    auVar184._8_4_ = auVar183._8_4_ * auVar61._8_4_;
                    auVar184._12_4_ = auVar183._12_4_ * auVar61._12_4_;
                    auVar56 = vfmsub231ps_fma(auVar184,auVar56,auVar62);
                    auVar62 = vshufps_avx(auVar56,auVar56,0xc9);
                    auVar61 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar56 = vshufps_avx(auVar56,auVar56,0xd2);
                    auVar129._0_4_ = auVar65._0_4_ * auVar56._0_4_;
                    auVar129._4_4_ = auVar65._4_4_ * auVar56._4_4_;
                    auVar129._8_4_ = auVar65._8_4_ * auVar56._8_4_;
                    auVar129._12_4_ = auVar65._12_4_ * auVar56._12_4_;
                    auVar62 = vfmsub231ps_fma(auVar129,auVar62,auVar61);
                    local_460 = (RTCHitN  [16])vshufps_avx(auVar62,auVar62,0x55);
                    auStack_450 = vshufps_avx(auVar62,auVar62,0xaa);
                    local_440 = auVar62._0_4_;
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    local_430 = fVar154;
                    fStack_42c = fVar154;
                    fStack_428 = fVar154;
                    fStack_424 = fVar154;
                    local_420 = ZEXT416(0) << 0x20;
                    local_410 = local_470._0_8_;
                    uStack_408 = local_470._8_8_;
                    local_400 = local_480;
                    vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                    uStack_3ec = context->user->instID[0];
                    local_3f0 = uStack_3ec;
                    uStack_3e8 = uStack_3ec;
                    uStack_3e4 = uStack_3ec;
                    uStack_3e0 = context->user->instPrimID[0];
                    uStack_3dc = uStack_3e0;
                    uStack_3d8 = uStack_3e0;
                    uStack_3d4 = uStack_3e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar136;
                    local_8b0 = local_490;
                    local_7f0.valid = (int *)local_8b0;
                    local_7f0.geometryUserPtr = pGVar1->userPtr;
                    local_7f0.context = context->user;
                    local_7f0.hit = local_460;
                    local_7f0.N = 4;
                    local_880._0_4_ = fVar156;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar242);
                      (*pGVar1->occlusionFilterN)(&local_7f0);
                      auVar246 = ZEXT3264(local_860);
                      auVar227 = ZEXT3264(local_7c0);
                      auVar235 = ZEXT3264(local_7a0);
                      auVar224 = ZEXT3264(local_780);
                      auVar229 = ZEXT3264(local_760);
                      auVar239 = ZEXT3264(local_740);
                      auVar245 = ZEXT3264(local_720);
                      auVar244 = ZEXT3264(local_700);
                      fVar156 = (float)local_880._0_4_;
                    }
                    uVar54 = vptestmd_avx512vl(local_8b0,local_8b0);
                    if ((uVar54 & 0xf) != 0) {
                      p_Var2 = context->args->filter;
                      if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        (*p_Var2)(&local_7f0);
                        auVar246 = ZEXT3264(local_860);
                        auVar227 = ZEXT3264(local_7c0);
                        auVar235 = ZEXT3264(local_7a0);
                        auVar224 = ZEXT3264(local_780);
                        auVar229 = ZEXT3264(local_760);
                        auVar239 = ZEXT3264(local_740);
                        auVar245 = ZEXT3264(local_720);
                        auVar244 = ZEXT3264(local_700);
                        fVar156 = (float)local_880._0_4_;
                      }
                      uVar54 = vptestmd_avx512vl(local_8b0,local_8b0);
                      uVar54 = uVar54 & 0xf;
                      auVar62 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar3 = (bool)((byte)uVar54 & 1);
                      bVar4 = (bool)((byte)(uVar54 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
                      bVar6 = SUB81(uVar54 >> 3,0);
                      *(uint *)(local_7f0.ray + 0x80) =
                           (uint)bVar3 * auVar62._0_4_ |
                           (uint)!bVar3 * *(int *)(local_7f0.ray + 0x80);
                      *(uint *)(local_7f0.ray + 0x84) =
                           (uint)bVar4 * auVar62._4_4_ |
                           (uint)!bVar4 * *(int *)(local_7f0.ray + 0x84);
                      *(uint *)(local_7f0.ray + 0x88) =
                           (uint)bVar5 * auVar62._8_4_ |
                           (uint)!bVar5 * *(int *)(local_7f0.ray + 0x88);
                      *(uint *)(local_7f0.ray + 0x8c) =
                           (uint)bVar6 * auVar62._12_4_ |
                           (uint)!bVar6 * *(int *)(local_7f0.ray + 0x8c);
                      bVar44 = 1;
                      if ((byte)uVar54 != 0) goto LAB_01827bbc;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar156;
                  }
                }
                bVar44 = 0;
                goto LAB_01827bbc;
              }
            }
            uVar50 = uVar50 + 1;
            auVar224 = ZEXT3264(local_780);
            auVar227 = ZEXT3264(local_7c0);
          }
          bVar51 = false;
LAB_01827bbc:
          bVar45 = bVar45 | bVar51 & bVar44;
          uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar216._4_4_ = uVar138;
          auVar216._0_4_ = uVar138;
          auVar216._8_4_ = uVar138;
          auVar216._12_4_ = uVar138;
          auVar216._16_4_ = uVar138;
          auVar216._20_4_ = uVar138;
          auVar216._24_4_ = uVar138;
          auVar216._28_4_ = uVar138;
          auVar208 = ZEXT3264(auVar216);
          auVar41._4_4_ = fStack_31c;
          auVar41._0_4_ = local_320;
          auVar41._8_4_ = fStack_318;
          auVar41._12_4_ = fStack_314;
          auVar41._16_4_ = fStack_310;
          auVar41._20_4_ = fStack_30c;
          auVar41._24_4_ = fStack_308;
          auVar41._28_4_ = fStack_304;
          uVar10 = vcmpps_avx512vl(auVar216,auVar41,0xd);
        }
        uVar12 = vpcmpd_avx512vl(local_2e0,local_280,1);
        uVar11 = vpcmpd_avx512vl(local_2e0,_local_340,1);
        auVar153._0_4_ = (float)local_6a0._0_4_ + (float)local_1c0._0_4_;
        auVar153._4_4_ = (float)local_6a0._4_4_ + (float)local_1c0._4_4_;
        auVar153._8_4_ = fStack_698 + fStack_1b8;
        auVar153._12_4_ = fStack_694 + fStack_1b4;
        auVar153._16_4_ = fStack_690 + fStack_1b0;
        auVar153._20_4_ = fStack_68c + fStack_1ac;
        auVar153._24_4_ = fStack_688 + fStack_1a8;
        auVar153._28_4_ = fStack_684 + fStack_1a4;
        uVar138 = auVar208._0_4_;
        auVar188._4_4_ = uVar138;
        auVar188._0_4_ = uVar138;
        auVar188._8_4_ = uVar138;
        auVar188._12_4_ = uVar138;
        auVar188._16_4_ = uVar138;
        auVar188._20_4_ = uVar138;
        auVar188._24_4_ = uVar138;
        auVar188._28_4_ = uVar138;
        uVar10 = vcmpps_avx512vl(auVar153,auVar188,2);
        bVar48 = (byte)local_88c & (byte)uVar12 & (byte)uVar10;
        auVar197._0_4_ = (float)local_6a0._0_4_ + (float)local_2c0._0_4_;
        auVar197._4_4_ = (float)local_6a0._4_4_ + (float)local_2c0._4_4_;
        auVar197._8_4_ = fStack_698 + fStack_2b8;
        auVar197._12_4_ = fStack_694 + fStack_2b4;
        auVar197._16_4_ = fStack_690 + fStack_2b0;
        auVar197._20_4_ = fStack_68c + fStack_2ac;
        auVar197._24_4_ = fStack_688 + fStack_2a8;
        auVar197._28_4_ = fStack_684 + fStack_2a4;
        uVar10 = vcmpps_avx512vl(auVar197,auVar188,2);
        bVar43 = bVar43 & (byte)uVar11 & (byte)uVar10 | bVar48;
        if (bVar43 != 0) {
          uVar50 = (ulong)uVar47;
          abStack_180[uVar50 * 0x60] = bVar43;
          bVar51 = (bool)(bVar48 >> 1 & 1);
          bVar3 = (bool)(bVar48 >> 2 & 1);
          bVar4 = (bool)(bVar48 >> 3 & 1);
          bVar5 = (bool)(bVar48 >> 4 & 1);
          bVar6 = (bool)(bVar48 >> 5 & 1);
          bVar7 = (bool)(bVar48 >> 6 & 1);
          auStack_160[uVar50 * 0x18] =
               (uint)(bVar48 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar48 & 1) * local_2c0._0_4_;
          auStack_160[uVar50 * 0x18 + 1] =
               (uint)bVar51 * local_1c0._4_4_ | (uint)!bVar51 * local_2c0._4_4_;
          auStack_160[uVar50 * 0x18 + 2] =
               (uint)bVar3 * (int)fStack_1b8 | (uint)!bVar3 * (int)fStack_2b8;
          auStack_160[uVar50 * 0x18 + 3] =
               (uint)bVar4 * (int)fStack_1b4 | (uint)!bVar4 * (int)fStack_2b4;
          auStack_160[uVar50 * 0x18 + 4] =
               (uint)bVar5 * (int)fStack_1b0 | (uint)!bVar5 * (int)fStack_2b0;
          auStack_160[uVar50 * 0x18 + 5] =
               (uint)bVar6 * (int)fStack_1ac | (uint)!bVar6 * (int)fStack_2ac;
          auStack_160[uVar50 * 0x18 + 6] =
               (uint)bVar7 * (int)fStack_1a8 | (uint)!bVar7 * (int)fStack_2a8;
          auStack_160[uVar50 * 0x18 + 7] =
               (uint)(bVar48 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar48 >> 7) * (int)fStack_2a4;
          uVar54 = vmovlps_avx(local_2f0);
          (&uStack_140)[uVar50 * 0xc] = uVar54;
          aiStack_138[uVar50 * 0x18] = local_a00 + 1;
          uVar47 = uVar47 + 1;
        }
        auVar208 = ZEXT3264(_DAT_01f7b040);
        prim = local_800;
        fVar136 = (float)local_6a0._0_4_;
        fVar154 = (float)local_6a0._4_4_;
        fVar156 = fStack_698;
        fVar158 = fStack_694;
        fVar120 = fStack_690;
        fVar160 = fStack_68c;
        fVar162 = fStack_688;
        fVar164 = fStack_684;
      }
    }
    do {
      uVar55 = uVar47;
      uVar112 = uVar55 - 1;
      if (uVar55 == 0) {
        if (bVar45 != 0) goto LAB_01828150;
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar26._4_4_ = uVar138;
        auVar26._0_4_ = uVar138;
        auVar26._8_4_ = uVar138;
        auVar26._12_4_ = uVar138;
        uVar10 = vcmpps_avx512vl(local_300,auVar26,2);
        local_7f8 = (ulong)((uint)local_5c8 & (uint)uVar10);
        goto LAB_0182590f;
      }
      uVar54 = (ulong)uVar112;
      auVar69 = *(undefined1 (*) [32])(auStack_160 + uVar54 * 0x18);
      auVar150._0_4_ = fVar136 + auVar69._0_4_;
      auVar150._4_4_ = fVar154 + auVar69._4_4_;
      auVar150._8_4_ = fVar156 + auVar69._8_4_;
      auVar150._12_4_ = fVar158 + auVar69._12_4_;
      auVar150._16_4_ = fVar120 + auVar69._16_4_;
      auVar150._20_4_ = fVar160 + auVar69._20_4_;
      auVar150._24_4_ = fVar162 + auVar69._24_4_;
      auVar150._28_4_ = fVar164 + auVar69._28_4_;
      uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar138;
      auVar29._0_4_ = uVar138;
      auVar29._8_4_ = uVar138;
      auVar29._12_4_ = uVar138;
      auVar29._16_4_ = uVar138;
      auVar29._20_4_ = uVar138;
      auVar29._24_4_ = uVar138;
      auVar29._28_4_ = uVar138;
      uVar10 = vcmpps_avx512vl(auVar150,auVar29,2);
      uVar113 = (uint)uVar10 & (uint)abStack_180[uVar54 * 0x60];
      uVar47 = uVar112;
    } while (uVar113 == 0);
    uVar50 = (&uStack_140)[uVar54 * 0xc];
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar50;
    auVar187._8_4_ = 0x7f800000;
    auVar187._0_8_ = 0x7f8000007f800000;
    auVar187._12_4_ = 0x7f800000;
    auVar187._16_4_ = 0x7f800000;
    auVar187._20_4_ = 0x7f800000;
    auVar187._24_4_ = 0x7f800000;
    auVar187._28_4_ = 0x7f800000;
    auVar79 = vblendmps_avx512vl(auVar187,auVar69);
    bVar43 = (byte)uVar113;
    auVar109._0_4_ =
         (uint)(bVar43 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar43 & 1) * (int)auVar69._0_4_;
    bVar51 = (bool)((byte)(uVar113 >> 1) & 1);
    auVar109._4_4_ = (uint)bVar51 * auVar79._4_4_ | (uint)!bVar51 * (int)auVar69._4_4_;
    bVar51 = (bool)((byte)(uVar113 >> 2) & 1);
    auVar109._8_4_ = (uint)bVar51 * auVar79._8_4_ | (uint)!bVar51 * (int)auVar69._8_4_;
    bVar51 = (bool)((byte)(uVar113 >> 3) & 1);
    auVar109._12_4_ = (uint)bVar51 * auVar79._12_4_ | (uint)!bVar51 * (int)auVar69._12_4_;
    bVar51 = (bool)((byte)(uVar113 >> 4) & 1);
    auVar109._16_4_ = (uint)bVar51 * auVar79._16_4_ | (uint)!bVar51 * (int)auVar69._16_4_;
    bVar51 = (bool)((byte)(uVar113 >> 5) & 1);
    auVar109._20_4_ = (uint)bVar51 * auVar79._20_4_ | (uint)!bVar51 * (int)auVar69._20_4_;
    bVar51 = (bool)((byte)(uVar113 >> 6) & 1);
    auVar109._24_4_ = (uint)bVar51 * auVar79._24_4_ | (uint)!bVar51 * (int)auVar69._24_4_;
    auVar109._28_4_ =
         (uVar113 >> 7) * auVar79._28_4_ | (uint)!SUB41(uVar113 >> 7,0) * (int)auVar69._28_4_;
    auVar69 = vshufps_avx(auVar109,auVar109,0xb1);
    auVar69 = vminps_avx(auVar109,auVar69);
    auVar79 = vshufpd_avx(auVar69,auVar69,5);
    auVar69 = vminps_avx(auVar69,auVar79);
    auVar79 = vpermpd_avx2(auVar69,0x4e);
    auVar69 = vminps_avx(auVar69,auVar79);
    uVar10 = vcmpps_avx512vl(auVar109,auVar69,0);
    bVar48 = (byte)uVar10 & bVar43;
    if (bVar48 != 0) {
      uVar113 = (uint)bVar48;
    }
    uVar114 = 0;
    for (; (uVar113 & 1) == 0; uVar113 = uVar113 >> 1 | 0x80000000) {
      uVar114 = uVar114 + 1;
    }
    local_a00 = aiStack_138[uVar54 * 0x18];
    bVar43 = ~('\x01' << ((byte)uVar114 & 0x1f)) & bVar43;
    abStack_180[uVar54 * 0x60] = bVar43;
    uVar47 = uVar55;
    if (bVar43 == 0) {
      uVar47 = uVar112;
    }
    uVar138 = (undefined4)uVar50;
    auVar130._4_4_ = uVar138;
    auVar130._0_4_ = uVar138;
    auVar130._8_4_ = uVar138;
    auVar130._12_4_ = uVar138;
    auVar130._16_4_ = uVar138;
    auVar130._20_4_ = uVar138;
    auVar130._24_4_ = uVar138;
    auVar130._28_4_ = uVar138;
    auVar62 = vmovshdup_avx(auVar141);
    auVar62 = vsubps_avx(auVar62,auVar141);
    auVar151._0_4_ = auVar62._0_4_;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar151._16_4_ = auVar151._0_4_;
    auVar151._20_4_ = auVar151._0_4_;
    auVar151._24_4_ = auVar151._0_4_;
    auVar151._28_4_ = auVar151._0_4_;
    auVar62 = vfmadd132ps_fma(auVar151,auVar130,auVar208._0_32_);
    _local_460 = ZEXT1632(auVar62);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_460 + (ulong)uVar114 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }